

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

void embree::avx::ConeCurveMiMBIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  float fVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  uint uVar81;
  uint uVar82;
  long lVar83;
  uint uVar84;
  undefined1 auVar85 [8];
  ulong uVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar100;
  float fVar103;
  undefined1 auVar90 [16];
  float fVar109;
  float fVar112;
  float fVar114;
  undefined1 auVar93 [32];
  float fVar101;
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar110;
  float fVar113;
  float fVar115;
  float fVar116;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar102;
  float fVar105;
  float fVar108;
  float fVar111;
  undefined1 auVar96 [32];
  undefined1 auVar91 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar117;
  float fVar126;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar127;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar128;
  float fVar142;
  undefined1 auVar129 [16];
  float fVar140;
  float fVar141;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar143;
  float fVar146;
  float fVar147;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar148;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar171;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  float fVar172;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [28];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  float fVar201;
  float fVar202;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar219;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar230;
  undefined1 auVar223 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  float fVar234;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar245;
  undefined1 auVar238 [64];
  float fVar246;
  undefined1 auVar247 [32];
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar248 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RoundLineIntersectorHitM<8> hit;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 (*local_6a0) [16];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  RayHitK<8> *local_5b0;
  size_t local_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined4 uStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar92 [32];
  undefined1 auVar218 [64];
  
  pSVar10 = context->scene;
  uVar84 = line->sharedGeomID;
  pGVar11 = (pSVar10->geometries).items[uVar84].ptr;
  fVar202 = (pGVar11->time_range).lower;
  fVar202 = pGVar11->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar202) / ((pGVar11->time_range).upper - fVar202));
  auVar91 = vroundss_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),9);
  auVar91 = vminss_avx(auVar91,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar91 = vmaxss_avx(ZEXT816(0),auVar91);
  uVar82 = (line->v0).field_0.i[0];
  lVar12 = *(long *)&pGVar11[3].time_range.upper;
  lVar83 = (long)(int)auVar91._0_4_ * 0x38;
  lVar13 = *(long *)(lVar12 + lVar83);
  lVar14 = *(long *)(lVar12 + 0x10 + lVar83);
  uVar81 = (line->v0).field_0.i[1];
  uVar4 = (line->v0).field_0.i[2];
  uVar5 = (line->v0).field_0.i[4];
  puVar1 = (undefined8 *)(lVar13 + lVar14 * (ulong)uVar5);
  uStack_5d0 = *puVar1;
  _local_5e0 = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)uVar82);
  uStack_5c8 = puVar1[1];
  uVar6 = (line->v0).field_0.i[5];
  puVar1 = (undefined8 *)(lVar13 + lVar14 * (ulong)uVar6);
  uStack_5f0 = *puVar1;
  _local_600 = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)uVar81);
  uStack_5e8 = puVar1[1];
  uVar7 = (line->v0).field_0.i[6];
  auVar149._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)uVar7);
  auVar149._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)uVar4);
  uVar8 = (line->v0).field_0.i[3];
  uVar9 = (line->v0).field_0.i[7];
  auVar160._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)uVar9);
  auVar160._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)uVar8);
  auVar165._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar5 + 1));
  auVar165._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar82 + 1));
  auVar173._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar6 + 1));
  auVar173._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar81 + 1));
  auVar187._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar7 + 1));
  auVar187._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar4 + 1));
  auVar196._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar9 + 1));
  auVar196._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar8 + 1));
  lVar13 = *(long *)(lVar12 + 0x38 + lVar83);
  lVar12 = *(long *)(lVar12 + 0x48 + lVar83);
  auVar203._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar5 * lVar12);
  auVar203._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar82 * lVar12);
  auVar214._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar6 * lVar12);
  auVar214._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar81 * lVar12);
  auVar220._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar7 * lVar12);
  auVar220._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar4 * lVar12);
  auVar235._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar9 * lVar12);
  auVar235._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar8 * lVar12);
  auVar130._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar5 + 1) * lVar12);
  auVar130._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar82 + 1) * lVar12);
  auVar118._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar7 + 1) * lVar12);
  auVar118._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar4 + 1) * lVar12);
  fVar202 = fVar202 - auVar91._0_4_;
  auVar178 = vunpcklps_avx(_local_5e0,auVar149);
  auVar232 = vunpckhps_avx(_local_5e0,auVar149);
  auVar192 = vunpcklps_avx(_local_600,auVar160);
  auVar163 = vunpckhps_avx(_local_600,auVar160);
  auVar44 = vunpcklps_avx(auVar178,auVar192);
  auVar178 = vunpckhps_avx(auVar178,auVar192);
  auVar45 = vunpcklps_avx(auVar232,auVar163);
  auVar232 = vunpckhps_avx(auVar232,auVar163);
  auVar205 = vunpcklps_avx(auVar165,auVar187);
  auVar163 = vunpckhps_avx(auVar165,auVar187);
  auVar237 = vunpcklps_avx(auVar173,auVar196);
  auVar192 = vunpckhps_avx(auVar173,auVar196);
  auVar46 = vunpcklps_avx(auVar205,auVar237);
  auVar205 = vunpckhps_avx(auVar205,auVar237);
  auVar47 = vunpcklps_avx(auVar163,auVar192);
  auVar163 = vunpckhps_avx(auVar163,auVar192);
  auVar247 = vunpcklps_avx(auVar203,auVar220);
  auVar192 = vunpckhps_avx(auVar203,auVar220);
  auVar48 = vunpcklps_avx(auVar214,auVar235);
  auVar237 = vunpckhps_avx(auVar214,auVar235);
  auVar92 = vunpcklps_avx(auVar247,auVar48);
  auVar247 = vunpckhps_avx(auVar247,auVar48);
  auVar93 = vunpcklps_avx(auVar192,auVar237);
  auVar192 = vunpckhps_avx(auVar192,auVar237);
  auVar49 = vunpcklps_avx(auVar130,auVar118);
  auVar237 = vunpckhps_avx(auVar130,auVar118);
  auVar131._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar6 + 1) * lVar12);
  auVar131._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar81 + 1) * lVar12);
  auVar221._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar12 * (ulong)(uVar9 + 1));
  auVar221._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar8 + 1) * lVar12);
  auVar118 = vunpcklps_avx(auVar131,auVar221);
  auVar48 = vunpckhps_avx(auVar131,auVar221);
  auVar119 = vunpcklps_avx(auVar49,auVar118);
  auVar49 = vunpckhps_avx(auVar49,auVar118);
  auVar118 = vunpcklps_avx(auVar237,auVar48);
  auVar237 = vunpckhps_avx(auVar237,auVar48);
  auVar91 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
  auVar43 = vshufps_avx(ZEXT416((uint)(1.0 - fVar202)),ZEXT416((uint)(1.0 - fVar202)),0);
  fVar202 = auVar91._0_4_;
  fVar208 = auVar91._4_4_;
  fVar246 = auVar91._8_4_;
  fVar143 = auVar91._12_4_;
  fVar116 = auVar92._28_4_;
  fVar128 = auVar43._0_4_;
  fVar140 = auVar43._4_4_;
  fVar141 = auVar43._8_4_;
  fVar142 = auVar43._12_4_;
  auVar150._0_4_ = auVar92._0_4_ * fVar202 + fVar128 * auVar44._0_4_;
  auVar150._4_4_ = auVar92._4_4_ * fVar208 + fVar140 * auVar44._4_4_;
  auVar150._8_4_ = auVar92._8_4_ * fVar246 + fVar141 * auVar44._8_4_;
  auVar150._12_4_ = auVar92._12_4_ * fVar143 + fVar142 * auVar44._12_4_;
  auVar150._16_4_ = auVar92._16_4_ * fVar202 + fVar128 * auVar44._16_4_;
  auVar150._20_4_ = auVar92._20_4_ * fVar208 + fVar140 * auVar44._20_4_;
  auVar150._24_4_ = auVar92._24_4_ * fVar246 + fVar141 * auVar44._24_4_;
  auVar150._28_4_ = fVar116 + auVar44._28_4_;
  auVar166._0_4_ = auVar178._0_4_ * fVar128 + fVar202 * auVar247._0_4_;
  auVar166._4_4_ = auVar178._4_4_ * fVar140 + fVar208 * auVar247._4_4_;
  auVar166._8_4_ = auVar178._8_4_ * fVar141 + fVar246 * auVar247._8_4_;
  auVar166._12_4_ = auVar178._12_4_ * fVar142 + fVar143 * auVar247._12_4_;
  auVar166._16_4_ = auVar178._16_4_ * fVar128 + fVar202 * auVar247._16_4_;
  auVar166._20_4_ = auVar178._20_4_ * fVar140 + fVar208 * auVar247._20_4_;
  auVar166._24_4_ = auVar178._24_4_ * fVar141 + fVar246 * auVar247._24_4_;
  auVar166._28_4_ = fVar116 + auVar247._28_4_;
  auVar215._0_4_ = auVar45._0_4_ * fVar128 + auVar93._0_4_ * fVar202;
  auVar215._4_4_ = auVar45._4_4_ * fVar140 + auVar93._4_4_ * fVar208;
  auVar215._8_4_ = auVar45._8_4_ * fVar141 + auVar93._8_4_ * fVar246;
  auVar215._12_4_ = auVar45._12_4_ * fVar142 + auVar93._12_4_ * fVar143;
  auVar215._16_4_ = auVar45._16_4_ * fVar128 + auVar93._16_4_ * fVar202;
  auVar215._20_4_ = auVar45._20_4_ * fVar140 + auVar93._20_4_ * fVar208;
  auVar215._24_4_ = auVar45._24_4_ * fVar141 + auVar93._24_4_ * fVar246;
  auVar215._28_4_ = fVar116 + auVar93._28_4_;
  auVar197._0_4_ = auVar192._0_4_ * fVar202 + fVar128 * auVar232._0_4_;
  auVar197._4_4_ = auVar192._4_4_ * fVar208 + fVar140 * auVar232._4_4_;
  auVar197._8_4_ = auVar192._8_4_ * fVar246 + fVar141 * auVar232._8_4_;
  auVar197._12_4_ = auVar192._12_4_ * fVar143 + fVar142 * auVar232._12_4_;
  auVar197._16_4_ = auVar192._16_4_ * fVar202 + fVar128 * auVar232._16_4_;
  auVar197._20_4_ = auVar192._20_4_ * fVar208 + fVar140 * auVar232._20_4_;
  auVar197._24_4_ = auVar192._24_4_ * fVar246 + fVar141 * auVar232._24_4_;
  auVar197._28_4_ = auVar192._28_4_ + auVar232._28_4_;
  auVar204._0_4_ = fVar128 * auVar46._0_4_ + auVar119._0_4_ * fVar202;
  auVar204._4_4_ = fVar140 * auVar46._4_4_ + auVar119._4_4_ * fVar208;
  auVar204._8_4_ = fVar141 * auVar46._8_4_ + auVar119._8_4_ * fVar246;
  auVar204._12_4_ = fVar142 * auVar46._12_4_ + auVar119._12_4_ * fVar143;
  auVar204._16_4_ = fVar128 * auVar46._16_4_ + auVar119._16_4_ * fVar202;
  auVar204._20_4_ = fVar140 * auVar46._20_4_ + auVar119._20_4_ * fVar208;
  auVar204._24_4_ = fVar141 * auVar46._24_4_ + auVar119._24_4_ * fVar246;
  auVar204._28_4_ = fVar143 + auVar232._28_4_;
  local_600._0_4_ = auVar205._0_4_;
  local_600._4_4_ = auVar205._4_4_;
  fStack_5f8 = auVar205._8_4_;
  fStack_5f4 = auVar205._12_4_;
  uStack_5f0._0_4_ = auVar205._16_4_;
  uStack_5f0._4_4_ = auVar205._20_4_;
  uStack_5e8._0_4_ = auVar205._24_4_;
  auVar222._0_4_ = auVar49._0_4_ * fVar202 + fVar128 * (float)local_600._0_4_;
  auVar222._4_4_ = auVar49._4_4_ * fVar208 + fVar140 * (float)local_600._4_4_;
  auVar222._8_4_ = auVar49._8_4_ * fVar246 + fVar141 * fStack_5f8;
  auVar222._12_4_ = auVar49._12_4_ * fVar143 + fVar142 * fStack_5f4;
  auVar222._16_4_ = auVar49._16_4_ * fVar202 + fVar128 * (float)uStack_5f0;
  auVar222._20_4_ = auVar49._20_4_ * fVar208 + fVar140 * uStack_5f0._4_4_;
  auVar222._24_4_ = auVar49._24_4_ * fVar246 + fVar141 * (float)uStack_5e8;
  auVar222._28_4_ = auVar192._28_4_ + fVar143;
  local_5e0._0_4_ = auVar47._0_4_;
  local_5e0._4_4_ = auVar47._4_4_;
  fStack_5d8 = auVar47._8_4_;
  fStack_5d4 = auVar47._12_4_;
  uStack_5d0._0_4_ = auVar47._16_4_;
  uStack_5d0._4_4_ = auVar47._20_4_;
  uStack_5c8._0_4_ = auVar47._24_4_;
  auVar236._0_4_ = fVar128 * (float)local_5e0._0_4_ + fVar202 * auVar118._0_4_;
  auVar236._4_4_ = fVar140 * (float)local_5e0._4_4_ + fVar208 * auVar118._4_4_;
  auVar236._8_4_ = fVar141 * fStack_5d8 + fVar246 * auVar118._8_4_;
  auVar236._12_4_ = fVar142 * fStack_5d4 + fVar143 * auVar118._12_4_;
  auVar236._16_4_ = fVar128 * (float)uStack_5d0 + fVar202 * auVar118._16_4_;
  auVar236._20_4_ = fVar140 * uStack_5d0._4_4_ + fVar208 * auVar118._20_4_;
  auVar236._24_4_ = fVar141 * (float)uStack_5c8 + fVar246 * auVar118._24_4_;
  auVar236._28_4_ = fVar143 + auVar118._28_4_;
  local_6e0._0_4_ = auVar163._0_4_;
  local_6e0._4_4_ = auVar163._4_4_;
  fStack_6d8 = auVar163._8_4_;
  fStack_6d4 = auVar163._12_4_;
  fStack_6d0 = auVar163._16_4_;
  fStack_6cc = auVar163._20_4_;
  fStack_6c8 = auVar163._24_4_;
  auVar90._0_4_ = fVar128 * (float)local_6e0._0_4_ + fVar202 * auVar237._0_4_;
  auVar90._4_4_ = fVar140 * (float)local_6e0._4_4_ + fVar208 * auVar237._4_4_;
  auVar90._8_4_ = fVar141 * fStack_6d8 + fVar246 * auVar237._8_4_;
  auVar90._12_4_ = fVar142 * fStack_6d4 + fVar143 * auVar237._12_4_;
  auVar92._16_4_ = fVar128 * fStack_6d0 + fVar202 * auVar237._16_4_;
  auVar92._0_16_ = auVar90;
  auVar92._20_4_ = fVar140 * fStack_6cc + fVar208 * auVar237._20_4_;
  auVar92._24_4_ = fVar141 * fStack_6c8 + fVar246 * auVar237._24_4_;
  auVar92._28_4_ = auVar118._28_4_ + auVar237._28_4_;
  auVar91 = vpcmpeqd_avx(auVar90,auVar90);
  auVar43 = vpcmpeqd_avx(auVar91,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar91 = vpcmpeqd_avx(auVar91,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_270 = vshufps_avx(ZEXT416(uVar84),ZEXT416(uVar84),0);
  local_280 = local_270;
  local_6e0._4_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
  local_5e0._4_4_ = *(undefined4 *)(ray + k * 4 + 0xa0);
  local_4e0 = *(float *)(ray + k * 4 + 0xc0);
  auVar129 = ZEXT416((uint)((float)local_6e0._4_4_ * (float)local_6e0._4_4_ +
                           (float)local_5e0._4_4_ * (float)local_5e0._4_4_ + local_4e0 * local_4e0))
  ;
  auVar129 = vshufps_avx(auVar129,auVar129,0);
  auVar132._16_16_ = auVar129;
  auVar132._0_16_ = auVar129;
  auVar232 = vrcpps_avx(auVar132);
  auVar93._16_16_ = auVar91;
  auVar93._0_16_ = auVar43;
  fVar143 = auVar232._0_4_;
  fVar128 = auVar232._4_4_;
  auVar163._4_4_ = fVar128 * auVar129._4_4_;
  auVar163._0_4_ = fVar143 * auVar129._0_4_;
  fVar140 = auVar232._8_4_;
  auVar163._8_4_ = fVar140 * auVar129._8_4_;
  fVar141 = auVar232._12_4_;
  auVar163._12_4_ = fVar141 * auVar129._12_4_;
  fVar142 = auVar232._16_4_;
  auVar163._16_4_ = fVar142 * auVar129._0_4_;
  fVar146 = auVar232._20_4_;
  auVar163._20_4_ = fVar146 * auVar129._4_4_;
  fVar147 = auVar232._24_4_;
  auVar163._24_4_ = fVar147 * auVar129._8_4_;
  auVar163._28_4_ = auVar91._12_4_;
  auVar119._8_4_ = 0x3f800000;
  auVar119._0_8_ = 0x3f8000003f800000;
  auVar119._12_4_ = 0x3f800000;
  auVar119._16_4_ = 0x3f800000;
  auVar119._20_4_ = 0x3f800000;
  auVar119._24_4_ = 0x3f800000;
  auVar119._28_4_ = 0x3f800000;
  auVar163 = vsubps_avx(auVar119,auVar163);
  fVar116 = auVar232._28_4_ + auVar163._28_4_;
  auVar192._4_4_ = (auVar204._4_4_ + auVar150._4_4_) * 0.5;
  auVar192._0_4_ = (auVar204._0_4_ + auVar150._0_4_) * 0.5;
  auVar192._8_4_ = (auVar204._8_4_ + auVar150._8_4_) * 0.5;
  auVar192._12_4_ = (auVar204._12_4_ + auVar150._12_4_) * 0.5;
  auVar192._16_4_ = (auVar204._16_4_ + auVar150._16_4_) * 0.5;
  auVar192._20_4_ = (auVar204._20_4_ + auVar150._20_4_) * 0.5;
  auVar192._24_4_ = (auVar204._24_4_ + auVar150._24_4_) * 0.5;
  auVar192._28_4_ = auVar204._28_4_ + auVar150._28_4_;
  auVar232._4_4_ = (auVar222._4_4_ + auVar166._4_4_) * 0.5;
  auVar232._0_4_ = (auVar222._0_4_ + auVar166._0_4_) * 0.5;
  auVar232._8_4_ = (auVar222._8_4_ + auVar166._8_4_) * 0.5;
  auVar232._12_4_ = (auVar222._12_4_ + auVar166._12_4_) * 0.5;
  auVar232._16_4_ = (auVar222._16_4_ + auVar166._16_4_) * 0.5;
  auVar232._20_4_ = (auVar222._20_4_ + auVar166._20_4_) * 0.5;
  auVar232._24_4_ = (auVar222._24_4_ + auVar166._24_4_) * 0.5;
  auVar232._28_4_ = auVar222._28_4_ + auVar166._28_4_;
  auVar178._4_4_ = (auVar215._4_4_ + auVar236._4_4_) * 0.5;
  auVar178._0_4_ = (auVar215._0_4_ + auVar236._0_4_) * 0.5;
  auVar178._8_4_ = (auVar215._8_4_ + auVar236._8_4_) * 0.5;
  auVar178._12_4_ = (auVar215._12_4_ + auVar236._12_4_) * 0.5;
  auVar178._16_4_ = (auVar215._16_4_ + auVar236._16_4_) * 0.5;
  auVar178._20_4_ = (auVar215._20_4_ + auVar236._20_4_) * 0.5;
  auVar178._24_4_ = (auVar215._24_4_ + auVar236._24_4_) * 0.5;
  auVar178._28_4_ = 0x3f000000;
  fVar202 = *(float *)(ray + k * 4 + 0x20);
  auVar161._4_4_ = fVar202;
  auVar161._0_4_ = fVar202;
  auVar161._8_4_ = fVar202;
  auVar161._12_4_ = fVar202;
  auVar161._16_4_ = fVar202;
  auVar161._20_4_ = fVar202;
  auVar161._24_4_ = fVar202;
  auVar161._28_4_ = fVar202;
  auVar232 = vsubps_avx(auVar232,auVar161);
  fVar208 = *(float *)(ray + k * 4 + 0x40);
  auVar174._4_4_ = fVar208;
  auVar174._0_4_ = fVar208;
  auVar174._8_4_ = fVar208;
  auVar174._12_4_ = fVar208;
  auVar174._16_4_ = fVar208;
  auVar174._20_4_ = fVar208;
  auVar174._24_4_ = fVar208;
  auVar174._28_4_ = fVar208;
  auVar178 = vsubps_avx(auVar178,auVar174);
  fVar246 = *(float *)(ray + k * 4);
  auVar144._4_4_ = fVar246;
  auVar144._0_4_ = fVar246;
  auVar144._8_4_ = fVar246;
  auVar144._12_4_ = fVar246;
  auVar144._16_4_ = fVar246;
  auVar144._20_4_ = fVar246;
  auVar144._24_4_ = fVar246;
  auVar144._28_4_ = fVar246;
  auVar192 = vsubps_avx(auVar192,auVar144);
  fStack_684 = auVar192._28_4_ + auVar232._28_4_ + auVar178._28_4_;
  fVar117 = ((float)local_6e0._4_4_ * auVar192._0_4_ +
            (float)local_5e0._4_4_ * auVar232._0_4_ + local_4e0 * auVar178._0_4_) *
            (fVar143 + fVar143 * auVar163._0_4_);
  fVar126 = ((float)local_6e0._4_4_ * auVar192._4_4_ +
            (float)local_5e0._4_4_ * auVar232._4_4_ + local_4e0 * auVar178._4_4_) *
            (fVar128 + fVar128 * auVar163._4_4_);
  fStack_698 = ((float)local_6e0._4_4_ * auVar192._8_4_ +
               (float)local_5e0._4_4_ * auVar232._8_4_ + local_4e0 * auVar178._8_4_) *
               (fVar140 + fVar140 * auVar163._8_4_);
  fStack_694 = ((float)local_6e0._4_4_ * auVar192._12_4_ +
               (float)local_5e0._4_4_ * auVar232._12_4_ + local_4e0 * auVar178._12_4_) *
               (fVar141 + fVar141 * auVar163._12_4_);
  fStack_690 = ((float)local_6e0._4_4_ * auVar192._16_4_ +
               (float)local_5e0._4_4_ * auVar232._16_4_ + local_4e0 * auVar178._16_4_) *
               (fVar142 + fVar142 * auVar163._16_4_);
  fStack_68c = ((float)local_6e0._4_4_ * auVar192._20_4_ +
               (float)local_5e0._4_4_ * auVar232._20_4_ + local_4e0 * auVar178._20_4_) *
               (fVar146 + fVar146 * auVar163._20_4_);
  fStack_688 = ((float)local_6e0._4_4_ * auVar192._24_4_ +
               (float)local_5e0._4_4_ * auVar232._24_4_ + local_4e0 * auVar178._24_4_) *
               (fVar147 + fVar147 * auVar163._24_4_);
  auVar133._0_4_ = fVar246 + (float)local_6e0._4_4_ * fVar117;
  auVar133._4_4_ = fVar246 + (float)local_6e0._4_4_ * fVar126;
  auVar133._8_4_ = fVar246 + (float)local_6e0._4_4_ * fStack_698;
  auVar133._12_4_ = fVar246 + (float)local_6e0._4_4_ * fStack_694;
  auVar133._16_4_ = fVar246 + (float)local_6e0._4_4_ * fStack_690;
  auVar133._20_4_ = fVar246 + (float)local_6e0._4_4_ * fStack_68c;
  auVar133._24_4_ = fVar246 + (float)local_6e0._4_4_ * fStack_688;
  auVar133._28_4_ = fVar246 + fVar116;
  auVar162._0_4_ = fVar202 + (float)local_5e0._4_4_ * fVar117;
  auVar162._4_4_ = fVar202 + (float)local_5e0._4_4_ * fVar126;
  auVar162._8_4_ = fVar202 + (float)local_5e0._4_4_ * fStack_698;
  auVar162._12_4_ = fVar202 + (float)local_5e0._4_4_ * fStack_694;
  auVar162._16_4_ = fVar202 + (float)local_5e0._4_4_ * fStack_690;
  auVar162._20_4_ = fVar202 + (float)local_5e0._4_4_ * fStack_68c;
  auVar162._24_4_ = fVar202 + (float)local_5e0._4_4_ * fStack_688;
  auVar162._28_4_ = fVar202 + fVar116;
  auVar120._0_4_ = fVar208 + local_4e0 * fVar117;
  auVar120._4_4_ = fVar208 + local_4e0 * fVar126;
  auVar120._8_4_ = fVar208 + local_4e0 * fStack_698;
  auVar120._12_4_ = fVar208 + local_4e0 * fStack_694;
  auVar120._16_4_ = fVar208 + local_4e0 * fStack_690;
  auVar120._20_4_ = fVar208 + local_4e0 * fStack_68c;
  auVar120._24_4_ = fVar208 + local_4e0 * fStack_688;
  auVar120._28_4_ = fVar208 + fVar116;
  auVar163 = vsubps_avx(auVar222,auVar166);
  local_500 = vsubps_avx(auVar236,auVar215);
  fVar202 = local_500._0_4_;
  fVar141 = local_500._4_4_;
  fVar18 = local_500._8_4_;
  fVar23 = local_500._12_4_;
  fVar28 = local_500._16_4_;
  fVar33 = local_500._20_4_;
  fVar38 = local_500._24_4_;
  fVar208 = auVar163._0_4_;
  fVar142 = auVar163._4_4_;
  fVar19 = auVar163._8_4_;
  fVar24 = auVar163._12_4_;
  fVar29 = auVar163._16_4_;
  fVar34 = auVar163._20_4_;
  fVar39 = auVar163._24_4_;
  local_680 = vsubps_avx(auVar204,auVar150);
  fVar143 = local_680._0_4_;
  fVar146 = local_680._4_4_;
  fVar20 = local_680._8_4_;
  fVar25 = local_680._12_4_;
  fVar30 = local_680._16_4_;
  fVar35 = local_680._20_4_;
  fVar40 = local_680._24_4_;
  fVar234 = fVar208 * fVar208 + fVar202 * fVar202 + fVar143 * fVar143;
  fVar239 = fVar142 * fVar142 + fVar141 * fVar141 + fVar146 * fVar146;
  fVar240 = fVar19 * fVar19 + fVar18 * fVar18 + fVar20 * fVar20;
  fVar241 = fVar24 * fVar24 + fVar23 * fVar23 + fVar25 * fVar25;
  fVar242 = fVar29 * fVar29 + fVar28 * fVar28 + fVar30 * fVar30;
  fVar243 = fVar34 * fVar34 + fVar33 * fVar33 + fVar35 * fVar35;
  fVar244 = fVar39 * fVar39 + fVar38 * fVar38 + fVar40 * fVar40;
  fVar245 = fVar246 + fVar116 + fVar246;
  _local_600 = vsubps_avx(auVar162,auVar166);
  local_520 = vsubps_avx(auVar120,auVar215);
  fVar201 = local_520._0_4_;
  fVar207 = local_520._4_4_;
  fVar209 = local_520._8_4_;
  fVar210 = local_520._12_4_;
  fVar211 = local_520._16_4_;
  fVar212 = local_520._20_4_;
  fVar213 = local_520._24_4_;
  fVar116 = local_600._0_4_;
  fVar147 = local_600._4_4_;
  fVar21 = local_600._8_4_;
  fVar26 = local_600._12_4_;
  fVar31 = local_600._16_4_;
  fVar36 = local_600._20_4_;
  fVar41 = local_600._24_4_;
  _local_480 = vsubps_avx(auVar133,auVar150);
  fVar128 = local_480._0_4_;
  fVar16 = local_480._4_4_;
  fVar22 = local_480._8_4_;
  fVar27 = local_480._12_4_;
  fVar32 = local_480._16_4_;
  fVar37 = local_480._20_4_;
  fVar42 = local_480._24_4_;
  fVar219 = fVar143 * fVar128 + fVar208 * fVar116 + fVar201 * fVar202;
  fVar224 = fVar146 * fVar16 + fVar142 * fVar147 + fVar207 * fVar141;
  fVar225 = fVar20 * fVar22 + fVar19 * fVar21 + fVar209 * fVar18;
  fVar226 = fVar25 * fVar27 + fVar24 * fVar26 + fVar210 * fVar23;
  fVar227 = fVar30 * fVar32 + fVar29 * fVar31 + fVar211 * fVar28;
  fVar228 = fVar35 * fVar37 + fVar34 * fVar36 + fVar212 * fVar33;
  fVar229 = fVar40 * fVar42 + fVar39 * fVar41 + fVar213 * fVar38;
  fVar230 = fVar246 + fVar246 + auVar120._28_4_;
  fVar127 = fVar246 + fVar246 + auVar120._28_4_;
  auVar216._0_4_ =
       (float)local_6e0._4_4_ * fVar143 + (float)local_5e0._4_4_ * fVar208 + local_4e0 * fVar202;
  auVar216._4_4_ =
       (float)local_6e0._4_4_ * fVar146 + (float)local_5e0._4_4_ * fVar142 + local_4e0 * fVar141;
  auVar216._8_4_ =
       (float)local_6e0._4_4_ * fVar20 + (float)local_5e0._4_4_ * fVar19 + local_4e0 * fVar18;
  auVar216._12_4_ =
       (float)local_6e0._4_4_ * fVar25 + (float)local_5e0._4_4_ * fVar24 + local_4e0 * fVar23;
  auVar216._16_4_ =
       (float)local_6e0._4_4_ * fVar30 + (float)local_5e0._4_4_ * fVar29 + local_4e0 * fVar28;
  auVar216._20_4_ =
       (float)local_6e0._4_4_ * fVar35 + (float)local_5e0._4_4_ * fVar34 + local_4e0 * fVar33;
  auVar216._24_4_ =
       (float)local_6e0._4_4_ * fVar40 + (float)local_5e0._4_4_ * fVar39 + local_4e0 * fVar38;
  auVar216._28_4_ = fVar246 + fVar127;
  local_5e0._0_4_ = local_5e0._4_4_;
  fStack_5d8 = (float)local_5e0._4_4_;
  fStack_5d4 = (float)local_5e0._4_4_;
  uStack_5d0._0_4_ = (float)local_5e0._4_4_;
  uStack_5d0._4_4_ = (float)local_5e0._4_4_;
  uStack_5c8._0_4_ = (float)local_5e0._4_4_;
  uStack_5c8._4_4_ = local_5e0._4_4_;
  local_6e0._0_4_ = local_6e0._4_4_;
  fStack_6d8 = (float)local_6e0._4_4_;
  fStack_6d4 = (float)local_6e0._4_4_;
  fStack_6d0 = (float)local_6e0._4_4_;
  fStack_6cc = (float)local_6e0._4_4_;
  fStack_6c8 = (float)local_6e0._4_4_;
  fStack_6c4 = (float)local_6e0._4_4_;
  auVar232 = vsubps_avx(auVar197,auVar92);
  fVar140 = auVar232._0_4_;
  fVar17 = auVar232._4_4_;
  fVar89 = auVar232._8_4_;
  fVar102 = auVar232._12_4_;
  fVar105 = auVar232._16_4_;
  fVar108 = auVar232._20_4_;
  fVar111 = auVar232._24_4_;
  fVar87 = fVar234 + fVar140 * fVar140;
  fVar100 = fVar239 + fVar17 * fVar17;
  fVar103 = fVar240 + fVar89 * fVar89;
  fVar106 = fVar241 + fVar102 * fVar102;
  fVar109 = fVar242 + fVar105 * fVar105;
  fVar112 = fVar243 + fVar108 * fVar108;
  fVar114 = fVar244 + fVar111 * fVar111;
  fVar148 = fVar234 * fVar234;
  fVar154 = fVar239 * fVar239;
  local_240._4_4_ = fVar154;
  local_240._0_4_ = fVar148;
  fVar155 = fVar240 * fVar240;
  fStack_238 = fVar155;
  fVar156 = fVar241 * fVar241;
  fStack_234 = fVar156;
  fVar157 = fVar242 * fVar242;
  fStack_230 = fVar157;
  fVar158 = fVar243 * fVar243;
  fStack_22c = fVar158;
  fVar159 = fVar244 * fVar244;
  fStack_228 = fVar159;
  uStack_224 = auVar150._28_4_;
  auVar205._4_4_ =
       fVar154 * ((float)local_6e0._4_4_ * fVar16 +
                 (float)local_5e0._4_4_ * fVar147 + local_4e0 * fVar207);
  auVar205._0_4_ =
       fVar148 * ((float)local_6e0._4_4_ * fVar128 +
                 (float)local_5e0._4_4_ * fVar116 + local_4e0 * fVar201);
  auVar205._8_4_ =
       fVar155 * ((float)local_6e0._4_4_ * fVar22 +
                 (float)local_5e0._4_4_ * fVar21 + local_4e0 * fVar209);
  auVar205._12_4_ =
       fVar156 * ((float)local_6e0._4_4_ * fVar27 +
                 (float)local_5e0._4_4_ * fVar26 + local_4e0 * fVar210);
  auVar205._16_4_ =
       fVar157 * ((float)local_6e0._4_4_ * fVar32 +
                 (float)local_5e0._4_4_ * fVar31 + local_4e0 * fVar211);
  auVar205._20_4_ =
       fVar158 * ((float)local_6e0._4_4_ * fVar37 +
                 (float)local_5e0._4_4_ * fVar36 + local_4e0 * fVar212);
  auVar205._24_4_ =
       fVar159 * ((float)local_6e0._4_4_ * fVar42 +
                 (float)local_5e0._4_4_ * fVar41 + local_4e0 * fVar213);
  auVar205._28_4_ = fVar246 + fVar246 + fVar127;
  fVar127 = local_500._28_4_;
  auVar237._4_4_ = fVar100 * auVar216._4_4_ * fVar224;
  auVar237._0_4_ = fVar87 * auVar216._0_4_ * fVar219;
  auVar237._8_4_ = fVar103 * auVar216._8_4_ * fVar225;
  auVar237._12_4_ = fVar106 * auVar216._12_4_ * fVar226;
  auVar237._16_4_ = fVar109 * auVar216._16_4_ * fVar227;
  auVar237._20_4_ = fVar112 * auVar216._20_4_ * fVar228;
  auVar237._24_4_ = fVar114 * auVar216._24_4_ * fVar229;
  auVar237._28_4_ = fVar127;
  auVar178 = vsubps_avx(auVar205,auVar237);
  fVar172 = auVar197._0_4_ * fVar234;
  fVar181 = auVar197._4_4_ * fVar239;
  auVar247._4_4_ = fVar181;
  auVar247._0_4_ = fVar172;
  fVar182 = auVar197._8_4_ * fVar240;
  auVar247._8_4_ = fVar182;
  fVar183 = auVar197._12_4_ * fVar241;
  auVar247._12_4_ = fVar183;
  fVar184 = auVar197._16_4_ * fVar242;
  auVar247._16_4_ = fVar184;
  fVar185 = auVar197._20_4_ * fVar243;
  auVar247._20_4_ = fVar185;
  fVar186 = auVar197._24_4_ * fVar244;
  auVar247._24_4_ = fVar186;
  auVar247._28_4_ = fVar127;
  auVar121._0_4_ = auVar216._0_4_ * fVar140 * fVar172 + auVar178._0_4_;
  auVar121._4_4_ = auVar216._4_4_ * fVar17 * fVar181 + auVar178._4_4_;
  auVar121._8_4_ = auVar216._8_4_ * fVar89 * fVar182 + auVar178._8_4_;
  auVar121._12_4_ = auVar216._12_4_ * fVar102 * fVar183 + auVar178._12_4_;
  auVar121._16_4_ = auVar216._16_4_ * fVar105 * fVar184 + auVar178._16_4_;
  auVar121._20_4_ = auVar216._20_4_ * fVar108 * fVar185 + auVar178._20_4_;
  auVar121._24_4_ = auVar216._24_4_ * fVar111 * fVar186 + auVar178._24_4_;
  auVar121._28_4_ = (float)local_6e0._4_4_ + auVar178._28_4_;
  auVar48._4_4_ = fVar154 * (fVar16 * fVar16 + fVar147 * fVar147 + fVar207 * fVar207);
  auVar48._0_4_ = fVar148 * (fVar128 * fVar128 + fVar116 * fVar116 + fVar201 * fVar201);
  auVar48._8_4_ = fVar155 * (fVar22 * fVar22 + fVar21 * fVar21 + fVar209 * fVar209);
  auVar48._12_4_ = fVar156 * (fVar27 * fVar27 + fVar26 * fVar26 + fVar210 * fVar210);
  auVar48._16_4_ = fVar157 * (fVar32 * fVar32 + fVar31 * fVar31 + fVar211 * fVar211);
  auVar48._20_4_ = fVar158 * (fVar37 * fVar37 + fVar36 * fVar36 + fVar212 * fVar212);
  auVar48._24_4_ = fVar159 * (fVar42 * fVar42 + fVar41 * fVar41 + fVar213 * fVar213);
  auVar48._28_4_ = auVar150._28_4_ + auVar150._28_4_ + fVar246;
  auVar49._4_4_ = fVar224 * fVar224 * fVar100;
  auVar49._0_4_ = fVar219 * fVar219 * fVar87;
  auVar49._8_4_ = fVar225 * fVar225 * fVar103;
  auVar49._12_4_ = fVar226 * fVar226 * fVar106;
  auVar49._16_4_ = fVar227 * fVar227 * fVar109;
  auVar49._20_4_ = fVar228 * fVar228 * fVar112;
  auVar49._24_4_ = fVar229 * fVar229 * fVar114;
  auVar49._28_4_ = local_6e0._4_4_;
  auVar178 = vsubps_avx(auVar48,auVar49);
  auVar44._4_4_ = (fVar17 + fVar17) * fVar224;
  auVar44._0_4_ = (fVar140 + fVar140) * fVar219;
  auVar44._8_4_ = (fVar89 + fVar89) * fVar225;
  auVar44._12_4_ = (fVar102 + fVar102) * fVar226;
  auVar44._16_4_ = (fVar105 + fVar105) * fVar227;
  auVar44._20_4_ = (fVar108 + fVar108) * fVar228;
  auVar44._24_4_ = (fVar111 + fVar111) * fVar229;
  auVar44._28_4_ = auVar232._28_4_ + auVar232._28_4_;
  auVar232 = vsubps_avx(auVar44,auVar247);
  fVar246 = auVar216._0_4_ * auVar216._0_4_;
  fVar249 = auVar216._4_4_ * auVar216._4_4_;
  fVar250 = auVar216._8_4_ * auVar216._8_4_;
  fVar251 = auVar216._12_4_ * auVar216._12_4_;
  fVar252 = auVar216._16_4_ * auVar216._16_4_;
  fVar253 = auVar216._20_4_ * auVar216._20_4_;
  fVar254 = auVar216._24_4_ * auVar216._24_4_;
  auVar45._4_4_ = fVar249 * fVar100;
  auVar45._0_4_ = fVar246 * fVar87;
  auVar45._8_4_ = fVar250 * fVar103;
  auVar45._12_4_ = fVar251 * fVar106;
  auVar45._16_4_ = fVar252 * fVar109;
  auVar45._20_4_ = fVar253 * fVar112;
  auVar45._24_4_ = fVar254 * fVar114;
  auVar45._28_4_ = fVar127;
  auVar192 = vsubps_avx(_local_240,auVar45);
  auVar46._4_4_ = auVar192._4_4_ * (auVar178._4_4_ + auVar232._4_4_ * fVar181);
  auVar46._0_4_ = auVar192._0_4_ * (auVar178._0_4_ + auVar232._0_4_ * fVar172);
  auVar46._8_4_ = auVar192._8_4_ * (auVar178._8_4_ + auVar232._8_4_ * fVar182);
  auVar46._12_4_ = auVar192._12_4_ * (auVar178._12_4_ + auVar232._12_4_ * fVar183);
  auVar46._16_4_ = auVar192._16_4_ * (auVar178._16_4_ + auVar232._16_4_ * fVar184);
  auVar46._20_4_ = auVar192._20_4_ * (auVar178._20_4_ + auVar232._20_4_ * fVar185);
  auVar46._24_4_ = auVar192._24_4_ * (auVar178._24_4_ + auVar232._24_4_ * fVar186);
  auVar46._28_4_ = auVar178._28_4_ + fVar127;
  auVar47._4_4_ = auVar121._4_4_ * auVar121._4_4_;
  auVar47._0_4_ = auVar121._0_4_ * auVar121._0_4_;
  auVar47._8_4_ = auVar121._8_4_ * auVar121._8_4_;
  auVar47._12_4_ = auVar121._12_4_ * auVar121._12_4_;
  auVar47._16_4_ = auVar121._16_4_ * auVar121._16_4_;
  auVar47._20_4_ = auVar121._20_4_ * auVar121._20_4_;
  auVar47._24_4_ = auVar121._24_4_ * auVar121._24_4_;
  auVar47._28_4_ = fVar127;
  auVar178 = vsubps_avx(auVar47,auVar46);
  auVar232 = vcmpps_avx(auVar178,ZEXT432(0) << 0x20,5);
  auVar205 = auVar232 & ~auVar93;
  if ((((((((auVar205 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar205 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar205 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar205 >> 0x7f,0) != '\0') ||
        (auVar205 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar205 >> 0xbf,0) != '\0') ||
      (auVar205 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar205[0x1f] < '\0')
  {
    auVar205 = vandnps_avx(auVar93,auVar232);
    auVar247 = vsubps_avx(auVar133,auVar204);
    auVar48 = vsubps_avx(auVar162,auVar222);
    auVar49 = vsubps_avx(auVar120,auVar236);
    fVar88 = auVar247._0_4_ * fVar143 + auVar48._0_4_ * fVar208 + auVar49._0_4_ * fVar202;
    fVar101 = auVar247._4_4_ * fVar146 + auVar48._4_4_ * fVar142 + auVar49._4_4_ * fVar141;
    fVar104 = auVar247._8_4_ * fVar20 + auVar48._8_4_ * fVar19 + auVar49._8_4_ * fVar18;
    fVar107 = auVar247._12_4_ * fVar25 + auVar48._12_4_ * fVar24 + auVar49._12_4_ * fVar23;
    fVar110 = auVar247._16_4_ * fVar30 + auVar48._16_4_ * fVar29 + auVar49._16_4_ * fVar28;
    fVar113 = auVar247._20_4_ * fVar35 + auVar48._20_4_ * fVar34 + auVar49._20_4_ * fVar33;
    fVar115 = auVar247._24_4_ * fVar40 + auVar48._24_4_ * fVar39 + auVar49._24_4_ * fVar38;
    auVar178 = vsqrtps_avx(auVar178);
    auVar237 = vrcpps_avx(auVar192);
    fVar172 = auVar237._0_4_;
    auVar167._0_4_ = auVar192._0_4_ * fVar172;
    fVar181 = auVar237._4_4_;
    auVar167._4_4_ = auVar192._4_4_ * fVar181;
    fVar182 = auVar237._8_4_;
    auVar167._8_4_ = auVar192._8_4_ * fVar182;
    fVar183 = auVar237._12_4_;
    auVar167._12_4_ = auVar192._12_4_ * fVar183;
    fVar184 = auVar237._16_4_;
    auVar167._16_4_ = auVar192._16_4_ * fVar184;
    fVar185 = auVar237._20_4_;
    auVar167._20_4_ = auVar192._20_4_ * fVar185;
    fVar186 = auVar237._24_4_;
    auVar167._24_4_ = auVar192._24_4_ * fVar186;
    auVar167._28_4_ = 0;
    auVar231._8_4_ = 0x3f800000;
    auVar231._0_8_ = 0x3f8000003f800000;
    auVar231._12_4_ = 0x3f800000;
    auVar231._16_4_ = 0x3f800000;
    auVar231._20_4_ = 0x3f800000;
    auVar231._24_4_ = 0x3f800000;
    auVar231._28_4_ = 0x3f800000;
    auVar44 = vsubps_avx(auVar231,auVar167);
    auVar175._8_4_ = 0x7fffffff;
    auVar175._0_8_ = 0x7fffffff7fffffff;
    auVar175._12_4_ = 0x7fffffff;
    auVar175._16_4_ = 0x7fffffff;
    auVar175._20_4_ = 0x7fffffff;
    auVar175._24_4_ = 0x7fffffff;
    auVar175._28_4_ = 0x7fffffff;
    fVar172 = fVar172 + fVar172 * auVar44._0_4_;
    fVar181 = fVar181 + fVar181 * auVar44._4_4_;
    fVar182 = fVar182 + fVar182 * auVar44._8_4_;
    fVar183 = fVar183 + fVar183 * auVar44._12_4_;
    fVar184 = fVar184 + fVar184 * auVar44._16_4_;
    fVar185 = fVar185 + fVar185 * auVar44._20_4_;
    fVar186 = fVar186 + fVar186 * auVar44._24_4_;
    auVar232 = vandps_avx(auVar192,auVar175);
    auVar188._8_4_ = 0x219392ef;
    auVar188._0_8_ = 0x219392ef219392ef;
    auVar188._12_4_ = 0x219392ef;
    auVar188._16_4_ = 0x219392ef;
    auVar188._20_4_ = 0x219392ef;
    auVar188._24_4_ = 0x219392ef;
    auVar188._28_4_ = 0x219392ef;
    auVar232 = vcmpps_avx(auVar232,auVar188,2);
    uVar86 = CONCAT44(auVar121._4_4_,auVar121._0_4_);
    auVar189._0_8_ = uVar86 ^ 0x8000000080000000;
    auVar189._8_4_ = -auVar121._8_4_;
    auVar189._12_4_ = -auVar121._12_4_;
    auVar189._16_4_ = -auVar121._16_4_;
    auVar189._20_4_ = -auVar121._20_4_;
    auVar189._24_4_ = -auVar121._24_4_;
    auVar189._28_4_ = -auVar121._28_4_;
    auVar192 = vsubps_avx(auVar189,auVar178);
    auVar45 = vsubps_avx(auVar178,auVar121);
    auVar50._4_4_ = auVar192._4_4_ * fVar181;
    auVar50._0_4_ = auVar192._0_4_ * fVar172;
    auVar50._8_4_ = auVar192._8_4_ * fVar182;
    auVar50._12_4_ = auVar192._12_4_ * fVar183;
    auVar50._16_4_ = auVar192._16_4_ * fVar184;
    auVar50._20_4_ = auVar192._20_4_ * fVar185;
    auVar50._24_4_ = auVar192._24_4_ * fVar186;
    auVar50._28_4_ = auVar178._28_4_;
    auVar51._4_4_ = auVar45._4_4_ * fVar181;
    auVar51._0_4_ = auVar45._0_4_ * fVar172;
    auVar51._8_4_ = auVar45._8_4_ * fVar182;
    auVar51._12_4_ = auVar45._12_4_ * fVar183;
    auVar51._16_4_ = auVar45._16_4_ * fVar184;
    auVar51._20_4_ = auVar45._20_4_ * fVar185;
    auVar51._24_4_ = auVar45._24_4_ * fVar186;
    auVar51._28_4_ = auVar45._28_4_;
    auVar94._8_4_ = 0xff800000;
    auVar94._0_8_ = 0xff800000ff800000;
    auVar94._12_4_ = 0xff800000;
    auVar94._16_4_ = 0xff800000;
    auVar94._20_4_ = 0xff800000;
    auVar94._24_4_ = 0xff800000;
    auVar94._28_4_ = 0xff800000;
    auVar178 = vblendvps_avx(auVar50,auVar94,auVar232);
    auVar151._8_4_ = 0x7f800000;
    auVar151._0_8_ = 0x7f8000007f800000;
    auVar151._12_4_ = 0x7f800000;
    auVar151._16_4_ = 0x7f800000;
    auVar151._20_4_ = 0x7f800000;
    auVar151._24_4_ = 0x7f800000;
    auVar151._28_4_ = 0x7f800000;
    auVar192 = vblendvps_avx(auVar51,auVar151,auVar232);
    auVar176._0_4_ = fVar219 + auVar216._0_4_ * auVar178._0_4_;
    auVar176._4_4_ = fVar224 + auVar216._4_4_ * auVar178._4_4_;
    auVar176._8_4_ = fVar225 + auVar216._8_4_ * auVar178._8_4_;
    auVar176._12_4_ = fVar226 + auVar216._12_4_ * auVar178._12_4_;
    auVar176._16_4_ = fVar227 + auVar216._16_4_ * auVar178._16_4_;
    auVar176._20_4_ = fVar228 + auVar216._20_4_ * auVar178._20_4_;
    auVar176._24_4_ = fVar229 + auVar216._24_4_ * auVar178._24_4_;
    auVar176._28_4_ = fVar230 + auVar237._28_4_ + auVar44._28_4_;
    auVar232 = vcmpps_avx(auVar176,ZEXT832(0) << 0x20,6);
    auVar78._4_4_ = fVar239;
    auVar78._0_4_ = fVar234;
    auVar78._8_4_ = fVar240;
    auVar78._12_4_ = fVar241;
    auVar78._16_4_ = fVar242;
    auVar78._20_4_ = fVar243;
    auVar78._24_4_ = fVar244;
    auVar78._28_4_ = fVar245;
    auVar237 = vcmpps_avx(auVar176,auVar78,1);
    auVar232 = vandps_avx(auVar237,auVar232);
    auVar232 = vandps_avx(auVar205,auVar232);
    local_380 = vblendvps_avx(auVar151,auVar178,auVar232);
    local_3a0._0_4_ = fVar219 + auVar216._0_4_ * auVar192._0_4_;
    local_3a0._4_4_ = fVar224 + auVar216._4_4_ * auVar192._4_4_;
    fStack_398 = fVar225 + auVar216._8_4_ * auVar192._8_4_;
    fStack_394 = fVar226 + auVar216._12_4_ * auVar192._12_4_;
    fStack_390 = fVar227 + auVar216._16_4_ * auVar192._16_4_;
    fStack_38c = fVar228 + auVar216._20_4_ * auVar192._20_4_;
    fStack_388 = fVar229 + auVar216._24_4_ * auVar192._24_4_;
    register0x0000139c = fVar230 + local_380._28_4_;
    auVar232 = vcmpps_avx(_local_3a0,ZEXT832(0) << 0x20,6);
    auVar178 = vcmpps_avx(_local_3a0,auVar78,1);
    auVar232 = vandps_avx(auVar178,auVar232);
    auVar232 = vandps_avx(auVar205,auVar232);
    local_580 = vblendvps_avx(auVar94,auVar192,auVar232);
    auVar192 = vrcpps_avx(auVar216);
    fVar172 = auVar192._0_4_;
    fVar181 = auVar192._4_4_;
    auVar52._4_4_ = auVar216._4_4_ * fVar181;
    auVar52._0_4_ = auVar216._0_4_ * fVar172;
    fVar182 = auVar192._8_4_;
    auVar52._8_4_ = auVar216._8_4_ * fVar182;
    fVar183 = auVar192._12_4_;
    auVar52._12_4_ = auVar216._12_4_ * fVar183;
    fVar184 = auVar192._16_4_;
    auVar52._16_4_ = auVar216._16_4_ * fVar184;
    fVar185 = auVar192._20_4_;
    auVar52._20_4_ = auVar216._20_4_ * fVar185;
    fVar186 = auVar192._24_4_;
    auVar52._24_4_ = auVar216._24_4_ * fVar186;
    auVar52._28_4_ = auVar232._28_4_;
    auVar44 = vsubps_avx(auVar231,auVar52);
    fVar172 = fVar172 + fVar172 * auVar44._0_4_;
    fVar181 = fVar181 + fVar181 * auVar44._4_4_;
    fVar182 = fVar182 + fVar182 * auVar44._8_4_;
    fVar183 = fVar183 + fVar183 * auVar44._12_4_;
    fVar184 = fVar184 + fVar184 * auVar44._16_4_;
    fVar185 = fVar185 + fVar185 * auVar44._20_4_;
    fVar186 = fVar186 + fVar186 * auVar44._24_4_;
    auVar53._4_4_ = auVar216._4_4_ * fVar16;
    auVar53._0_4_ = auVar216._0_4_ * fVar128;
    auVar53._8_4_ = auVar216._8_4_ * fVar22;
    auVar53._12_4_ = auVar216._12_4_ * fVar27;
    auVar53._16_4_ = auVar216._16_4_ * fVar32;
    auVar53._20_4_ = auVar216._20_4_ * fVar37;
    auVar53._24_4_ = auVar216._24_4_ * fVar42;
    auVar53._28_4_ = auVar44._28_4_;
    auVar54._4_4_ = (float)local_6e0._4_4_ * fVar224;
    auVar54._0_4_ = (float)local_6e0._4_4_ * fVar219;
    auVar54._8_4_ = (float)local_6e0._4_4_ * fVar225;
    auVar54._12_4_ = (float)local_6e0._4_4_ * fVar226;
    auVar54._16_4_ = (float)local_6e0._4_4_ * fVar227;
    auVar54._20_4_ = (float)local_6e0._4_4_ * fVar228;
    auVar54._24_4_ = (float)local_6e0._4_4_ * fVar229;
    auVar54._28_4_ = auVar178._28_4_;
    auVar232 = vsubps_avx(auVar53,auVar54);
    auVar55._4_4_ = auVar216._4_4_ * fVar147;
    auVar55._0_4_ = auVar216._0_4_ * fVar116;
    auVar55._8_4_ = auVar216._8_4_ * fVar21;
    auVar55._12_4_ = auVar216._12_4_ * fVar26;
    auVar55._16_4_ = auVar216._16_4_ * fVar31;
    auVar55._20_4_ = auVar216._20_4_ * fVar36;
    auVar55._24_4_ = auVar216._24_4_ * fVar41;
    auVar55._28_4_ = auVar178._28_4_;
    auVar56._4_4_ = fVar224 * (float)local_5e0._4_4_;
    auVar56._0_4_ = fVar219 * (float)local_5e0._4_4_;
    auVar56._8_4_ = fVar225 * (float)local_5e0._4_4_;
    auVar56._12_4_ = fVar226 * (float)local_5e0._4_4_;
    auVar56._16_4_ = fVar227 * (float)local_5e0._4_4_;
    auVar56._20_4_ = fVar228 * (float)local_5e0._4_4_;
    auVar56._24_4_ = fVar229 * (float)local_5e0._4_4_;
    auVar56._28_4_ = auVar237._28_4_;
    auVar178 = vsubps_avx(auVar55,auVar56);
    auVar57._4_4_ = auVar216._4_4_ * fVar207;
    auVar57._0_4_ = auVar216._0_4_ * fVar201;
    auVar57._8_4_ = auVar216._8_4_ * fVar209;
    auVar57._12_4_ = auVar216._12_4_ * fVar210;
    auVar57._16_4_ = auVar216._16_4_ * fVar211;
    auVar57._20_4_ = auVar216._20_4_ * fVar212;
    auVar57._24_4_ = auVar216._24_4_ * fVar213;
    auVar57._28_4_ = auVar237._28_4_;
    auVar198._0_4_ = local_4e0 * fVar219;
    auVar198._4_4_ = local_4e0 * fVar224;
    auVar198._8_4_ = local_4e0 * fVar225;
    auVar198._12_4_ = local_4e0 * fVar226;
    auVar198._16_4_ = local_4e0 * fVar227;
    auVar198._20_4_ = local_4e0 * fVar228;
    auVar198._24_4_ = local_4e0 * fVar229;
    auVar198._28_4_ = 0;
    auVar237 = vsubps_avx(auVar57,auVar198);
    fVar58 = auVar237._28_4_;
    fVar171 = auVar178._28_4_ + fVar58;
    auVar134._0_4_ =
         auVar232._0_4_ * auVar232._0_4_ +
         auVar178._0_4_ * auVar178._0_4_ + auVar237._0_4_ * auVar237._0_4_;
    auVar134._4_4_ =
         auVar232._4_4_ * auVar232._4_4_ +
         auVar178._4_4_ * auVar178._4_4_ + auVar237._4_4_ * auVar237._4_4_;
    auVar134._8_4_ =
         auVar232._8_4_ * auVar232._8_4_ +
         auVar178._8_4_ * auVar178._8_4_ + auVar237._8_4_ * auVar237._8_4_;
    auVar134._12_4_ =
         auVar232._12_4_ * auVar232._12_4_ +
         auVar178._12_4_ * auVar178._12_4_ + auVar237._12_4_ * auVar237._12_4_;
    auVar134._16_4_ =
         auVar232._16_4_ * auVar232._16_4_ +
         auVar178._16_4_ * auVar178._16_4_ + auVar237._16_4_ * auVar237._16_4_;
    auVar134._20_4_ =
         auVar232._20_4_ * auVar232._20_4_ +
         auVar178._20_4_ * auVar178._20_4_ + auVar237._20_4_ * auVar237._20_4_;
    auVar134._24_4_ =
         auVar232._24_4_ * auVar232._24_4_ +
         auVar178._24_4_ * auVar178._24_4_ + auVar237._24_4_ * auVar237._24_4_;
    auVar134._28_4_ = auVar232._28_4_ + fVar171;
    auVar59._4_4_ = fVar249 * auVar197._4_4_ * auVar197._4_4_;
    auVar59._0_4_ = fVar246 * auVar197._0_4_ * auVar197._0_4_;
    auVar59._8_4_ = fVar250 * auVar197._8_4_ * auVar197._8_4_;
    auVar59._12_4_ = fVar251 * auVar197._12_4_ * auVar197._12_4_;
    auVar59._16_4_ = fVar252 * auVar197._16_4_ * auVar197._16_4_;
    auVar59._20_4_ = fVar253 * auVar197._20_4_ * auVar197._20_4_;
    auVar59._24_4_ = fVar254 * auVar197._24_4_ * auVar197._24_4_;
    auVar59._28_4_ = fVar171;
    auVar232 = vcmpps_avx(auVar134,auVar59,1);
    auVar60._4_4_ = fVar181 * -fVar224;
    auVar60._0_4_ = fVar172 * -fVar219;
    auVar60._8_4_ = fVar182 * -fVar225;
    auVar60._12_4_ = fVar183 * -fVar226;
    auVar60._16_4_ = fVar184 * -fVar227;
    auVar60._20_4_ = fVar185 * -fVar228;
    auVar60._24_4_ = fVar186 * -fVar229;
    auVar60._28_4_ = -fVar230;
    auVar178 = vblendvps_avx(auVar151,auVar60,auVar232);
    auVar168._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar168._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->leftExists & 0xf) << 4));
    auVar232 = vandnps_avx(auVar168,auVar205);
    local_540 = vblendvps_avx(auVar151,auVar178,auVar232);
    auVar135._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar135._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar61._4_4_ = auVar216._4_4_ * auVar247._4_4_;
    auVar61._0_4_ = auVar216._0_4_ * auVar247._0_4_;
    auVar61._8_4_ = auVar216._8_4_ * auVar247._8_4_;
    auVar61._12_4_ = auVar216._12_4_ * auVar247._12_4_;
    auVar61._16_4_ = auVar216._16_4_ * auVar247._16_4_;
    auVar61._20_4_ = auVar216._20_4_ * auVar247._20_4_;
    auVar61._24_4_ = auVar216._24_4_ * auVar247._24_4_;
    auVar61._28_4_ = 0;
    auVar62._4_4_ = auVar216._4_4_ * auVar48._4_4_;
    auVar62._0_4_ = auVar216._0_4_ * auVar48._0_4_;
    auVar62._8_4_ = auVar216._8_4_ * auVar48._8_4_;
    auVar62._12_4_ = auVar216._12_4_ * auVar48._12_4_;
    auVar62._16_4_ = auVar216._16_4_ * auVar48._16_4_;
    auVar62._20_4_ = auVar216._20_4_ * auVar48._20_4_;
    auVar62._24_4_ = auVar216._24_4_ * auVar48._24_4_;
    auVar62._28_4_ = auVar232._28_4_;
    auVar63._4_4_ = auVar216._4_4_ * auVar49._4_4_;
    auVar63._0_4_ = auVar216._0_4_ * auVar49._0_4_;
    auVar63._8_4_ = auVar216._8_4_ * auVar49._8_4_;
    auVar63._12_4_ = auVar216._12_4_ * auVar49._12_4_;
    auVar63._16_4_ = auVar216._16_4_ * auVar49._16_4_;
    auVar63._20_4_ = auVar216._20_4_ * auVar49._20_4_;
    auVar63._24_4_ = auVar216._24_4_ * auVar49._24_4_;
    auVar63._28_4_ = 0;
    auVar64._4_4_ = (float)local_6e0._4_4_ * fVar101;
    auVar64._0_4_ = (float)local_6e0._4_4_ * fVar88;
    auVar64._8_4_ = (float)local_6e0._4_4_ * fVar104;
    auVar64._12_4_ = (float)local_6e0._4_4_ * fVar107;
    auVar64._16_4_ = (float)local_6e0._4_4_ * fVar110;
    auVar64._20_4_ = (float)local_6e0._4_4_ * fVar113;
    auVar64._24_4_ = (float)local_6e0._4_4_ * fVar115;
    auVar64._28_4_ = fVar58;
    auVar232 = vsubps_avx(auVar61,auVar64);
    auVar65._4_4_ = fVar101 * (float)local_5e0._4_4_;
    auVar65._0_4_ = fVar88 * (float)local_5e0._4_4_;
    auVar65._8_4_ = fVar104 * (float)local_5e0._4_4_;
    auVar65._12_4_ = fVar107 * (float)local_5e0._4_4_;
    auVar65._16_4_ = fVar110 * (float)local_5e0._4_4_;
    auVar65._20_4_ = fVar113 * (float)local_5e0._4_4_;
    auVar65._24_4_ = fVar115 * (float)local_5e0._4_4_;
    auVar65._28_4_ = fVar58;
    auVar178 = vsubps_avx(auVar62,auVar65);
    auVar66._4_4_ = local_4e0 * fVar101;
    auVar66._0_4_ = local_4e0 * fVar88;
    auVar66._8_4_ = local_4e0 * fVar104;
    auVar66._12_4_ = local_4e0 * fVar107;
    auVar66._16_4_ = local_4e0 * fVar110;
    auVar66._20_4_ = local_4e0 * fVar113;
    auVar66._24_4_ = local_4e0 * fVar115;
    auVar66._28_4_ = fVar58;
    auVar237 = vsubps_avx(auVar63,auVar66);
    auVar95._0_4_ =
         auVar232._0_4_ * auVar232._0_4_ +
         auVar178._0_4_ * auVar178._0_4_ + auVar237._0_4_ * auVar237._0_4_;
    auVar95._4_4_ =
         auVar232._4_4_ * auVar232._4_4_ +
         auVar178._4_4_ * auVar178._4_4_ + auVar237._4_4_ * auVar237._4_4_;
    auVar95._8_4_ =
         auVar232._8_4_ * auVar232._8_4_ +
         auVar178._8_4_ * auVar178._8_4_ + auVar237._8_4_ * auVar237._8_4_;
    auVar95._12_4_ =
         auVar232._12_4_ * auVar232._12_4_ +
         auVar178._12_4_ * auVar178._12_4_ + auVar237._12_4_ * auVar237._12_4_;
    auVar95._16_4_ =
         auVar232._16_4_ * auVar232._16_4_ +
         auVar178._16_4_ * auVar178._16_4_ + auVar237._16_4_ * auVar237._16_4_;
    auVar95._20_4_ =
         auVar232._20_4_ * auVar232._20_4_ +
         auVar178._20_4_ * auVar178._20_4_ + auVar237._20_4_ * auVar237._20_4_;
    auVar95._24_4_ =
         auVar232._24_4_ * auVar232._24_4_ +
         auVar178._24_4_ * auVar178._24_4_ + auVar237._24_4_ * auVar237._24_4_;
    auVar95._28_4_ = auVar232._28_4_ + auVar178._28_4_ + auVar237._28_4_;
    auVar67._4_4_ = fVar249 * auVar90._4_4_ * auVar90._4_4_;
    auVar67._0_4_ = fVar246 * auVar90._0_4_ * auVar90._0_4_;
    auVar67._8_4_ = fVar250 * auVar90._8_4_ * auVar90._8_4_;
    auVar67._12_4_ = fVar251 * auVar90._12_4_ * auVar90._12_4_;
    auVar67._16_4_ = fVar252 * auVar92._16_4_ * auVar92._16_4_;
    auVar67._20_4_ = fVar253 * auVar92._20_4_ * auVar92._20_4_;
    auVar67._24_4_ = fVar254 * auVar92._24_4_ * auVar92._24_4_;
    auVar67._28_4_ = auVar92._28_4_;
    auVar178 = vcmpps_avx(auVar95,auVar67,1);
    auVar91 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x60)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0);
    auVar232 = vandnps_avx(auVar135,auVar205);
    auVar68._4_4_ = fVar181 * -fVar101;
    auVar68._0_4_ = fVar172 * -fVar88;
    auVar68._8_4_ = fVar182 * -fVar104;
    auVar68._12_4_ = fVar183 * -fVar107;
    auVar68._16_4_ = fVar184 * -fVar110;
    auVar68._20_4_ = fVar185 * -fVar113;
    auVar68._24_4_ = fVar186 * -fVar115;
    auVar68._28_4_ = auVar192._28_4_ + auVar44._28_4_;
    auVar177._8_4_ = 0x7f800000;
    auVar177._0_8_ = 0x7f8000007f800000;
    auVar177._12_4_ = 0x7f800000;
    auVar177._16_4_ = 0x7f800000;
    auVar177._20_4_ = 0x7f800000;
    auVar177._24_4_ = 0x7f800000;
    auVar177._28_4_ = 0x7f800000;
    auVar178 = vblendvps_avx(auVar177,auVar68,auVar178);
    auVar232 = vblendvps_avx(auVar177,auVar178,auVar232);
    auVar192 = vmaxps_avx(local_540,auVar232);
    auVar178 = vcmpps_avx(auVar192,auVar177,0);
    auVar190._8_4_ = 0xff800000;
    auVar190._0_8_ = 0xff800000ff800000;
    auVar190._12_4_ = 0xff800000;
    auVar190._16_4_ = 0xff800000;
    auVar190._20_4_ = 0xff800000;
    auVar190._24_4_ = 0xff800000;
    auVar190._28_4_ = 0xff800000;
    auVar178 = vblendvps_avx(auVar192,auVar190,auVar178);
    auVar192 = vminps_avx(local_540,auVar232);
    auVar232 = vcmpps_avx(auVar192,auVar177,0);
    auVar232 = vblendvps_avx(auVar192,auVar190,auVar232);
    auVar237 = vminps_avx(local_380,auVar192);
    auVar192 = vcmpps_avx(auVar237,auVar192,0);
    auVar232 = vblendvps_avx(auVar232,auVar178,auVar192);
    auVar136._16_16_ = auVar91;
    auVar136._0_16_ = auVar91;
    local_2e0 = vmaxps_avx(local_580,auVar232);
    auVar122._0_4_ = fVar117 + auVar237._0_4_;
    auVar122._4_4_ = fVar126 + auVar237._4_4_;
    auVar122._8_4_ = fStack_698 + auVar237._8_4_;
    auVar122._12_4_ = fStack_694 + auVar237._12_4_;
    auVar122._16_4_ = fStack_690 + auVar237._16_4_;
    auVar122._20_4_ = fStack_68c + auVar237._20_4_;
    auVar122._24_4_ = fStack_688 + auVar237._24_4_;
    auVar122._28_4_ = fStack_684 + auVar237._28_4_;
    auVar232 = vcmpps_avx(auVar136,auVar122,2);
    auVar91 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x100)),0);
    auVar145._16_16_ = auVar91;
    auVar145._0_16_ = auVar91;
    auVar178 = vcmpps_avx(auVar122,auVar145,2);
    auVar232 = vandps_avx(auVar178,auVar232);
    auVar178 = vcmpps_avx(auVar177,auVar237,4);
    auVar178 = vandps_avx(auVar205,auVar178);
    local_4a0 = vandps_avx(auVar232,auVar178);
    local_620._0_4_ = fVar117 + local_2e0._0_4_;
    local_620._4_4_ = fVar126 + local_2e0._4_4_;
    local_620._8_4_ = fStack_698 + local_2e0._8_4_;
    local_620._12_4_ = fStack_694 + local_2e0._12_4_;
    local_620._16_4_ = fStack_690 + local_2e0._16_4_;
    local_620._20_4_ = fStack_68c + local_2e0._20_4_;
    local_620._24_4_ = fStack_688 + local_2e0._24_4_;
    fStack_284 = local_2e0._28_4_;
    local_620._28_4_ = fStack_684 + fStack_284;
    auVar232 = vcmpps_avx(auVar136,local_620,2);
    auVar178 = vcmpps_avx(local_620,auVar145,2);
    auVar232 = vandps_avx(auVar178,auVar232);
    auVar178 = vcmpps_avx(auVar190,local_2e0,4);
    auVar178 = vandps_avx(auVar205,auVar178);
    local_4c0 = vandps_avx(auVar232,auVar178);
    local_660 = vorps_avx(local_4a0,local_4c0);
    if ((((((((local_660 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_660 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_660 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_660 >> 0x7f,0) != '\0') ||
          (local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_660 >> 0xbf,0) != '\0') ||
        (local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_660[0x1f] < '\0') {
      auVar192 = vblendvps_avx(local_2e0,auVar237,local_4a0);
      auVar237 = vblendvps_avx(_local_3a0,auVar176,local_4a0);
      auVar79._4_4_ = fVar239;
      auVar79._0_4_ = fVar234;
      auVar79._8_4_ = fVar240;
      auVar79._12_4_ = fVar241;
      auVar79._16_4_ = fVar242;
      auVar79._20_4_ = fVar243;
      auVar79._24_4_ = fVar244;
      auVar79._28_4_ = fVar245;
      auVar232 = vrcpps_avx(auVar79);
      local_5a0 = auVar232._0_4_;
      fStack_59c = auVar232._4_4_;
      auVar69._4_4_ = fVar239 * fStack_59c;
      auVar69._0_4_ = fVar234 * local_5a0;
      fStack_598 = auVar232._8_4_;
      auVar69._8_4_ = fVar240 * fStack_598;
      fStack_594 = auVar232._12_4_;
      auVar69._12_4_ = fVar241 * fStack_594;
      fStack_590 = auVar232._16_4_;
      auVar69._16_4_ = fVar242 * fStack_590;
      fStack_58c = auVar232._20_4_;
      auVar69._20_4_ = fVar243 * fStack_58c;
      fStack_588 = auVar232._24_4_;
      auVar69._24_4_ = fVar244 * fStack_588;
      auVar69._28_4_ = local_620._28_4_;
      auVar223._8_4_ = 0x3f800000;
      auVar223._0_8_ = 0x3f8000003f800000;
      auVar223._12_4_ = 0x3f800000;
      auVar223._16_4_ = 0x3f800000;
      auVar223._20_4_ = 0x3f800000;
      auVar223._24_4_ = 0x3f800000;
      auVar223._28_4_ = 0x3f800000;
      auVar178 = vsubps_avx(auVar223,auVar69);
      local_5a0 = local_5a0 + local_5a0 * auVar178._0_4_;
      fStack_59c = fStack_59c + fStack_59c * auVar178._4_4_;
      fStack_598 = fStack_598 + fStack_598 * auVar178._8_4_;
      fStack_594 = fStack_594 + fStack_594 * auVar178._12_4_;
      fStack_590 = fStack_590 + fStack_590 * auVar178._16_4_;
      fStack_58c = fStack_58c + fStack_58c * auVar178._20_4_;
      fStack_588 = fStack_588 + fStack_588 * auVar178._24_4_;
      fStack_584 = auVar232._28_4_ + auVar178._28_4_;
      fVar182 = fVar234 * fVar140 * auVar197._0_4_;
      fVar183 = fVar239 * fVar17 * auVar197._4_4_;
      fVar184 = fVar240 * fVar89 * auVar197._8_4_;
      fVar185 = fVar241 * fVar102 * auVar197._12_4_;
      fVar186 = fVar242 * fVar105 * auVar197._16_4_;
      fVar219 = fVar243 * fVar108 * auVar197._20_4_;
      fVar224 = fVar244 * fVar111 * auVar197._24_4_;
      local_560 = fVar208 * fVar87;
      fStack_55c = fVar142 * fVar100;
      fStack_558 = fVar19 * fVar103;
      fStack_554 = fVar24 * fVar106;
      fStack_550 = fVar29 * fVar109;
      fStack_54c = fVar34 * fVar112;
      fStack_548 = fVar39 * fVar114;
      auVar232 = vcmpps_avx(auVar192,local_380,0);
      auVar178 = vcmpps_avx(auVar192,local_580,0);
      auVar232 = vorps_avx(auVar232,auVar178);
      auVar232 = vandps_avx(auVar205,auVar232);
      auVar247 = vcmpps_avx(local_540,auVar192,0);
      auVar178 = vandps_avx(auVar205,auVar247);
      fVar89 = auVar192._0_4_;
      fVar102 = auVar192._4_4_;
      fVar105 = auVar192._8_4_;
      fVar108 = auVar192._12_4_;
      fVar111 = auVar192._16_4_;
      fVar172 = auVar192._20_4_;
      fVar181 = auVar192._24_4_;
      fStack_2bc = fVar146 * fVar183;
      local_2c0 = fVar143 * fVar182;
      fStack_2b8 = fVar20 * fVar184;
      fStack_2b4 = fVar25 * fVar185;
      fStack_2b0 = fVar30 * fVar186;
      fStack_2ac = fVar35 * fVar219;
      fStack_2a8 = fVar40 * fVar224;
      fStack_2a4 = fStack_684;
      auVar137._0_4_ = fVar143 * fVar182 + fVar148 * (fVar89 * (float)local_6e0._4_4_ + fVar128);
      auVar137._4_4_ = fVar146 * fVar183 + fVar154 * (fVar102 * (float)local_6e0._4_4_ + fVar16);
      auVar137._8_4_ = fVar20 * fVar184 + fVar155 * (fVar105 * (float)local_6e0._4_4_ + fVar22);
      auVar137._12_4_ = fVar25 * fVar185 + fVar156 * (fVar108 * (float)local_6e0._4_4_ + fVar27);
      auVar137._16_4_ = fVar30 * fVar186 + fVar157 * (fVar111 * (float)local_6e0._4_4_ + fVar32);
      auVar137._20_4_ = fVar35 * fVar219 + fVar158 * (fVar172 * (float)local_6e0._4_4_ + fVar37);
      auVar137._24_4_ = fVar40 * fVar224 + fVar159 * (fVar181 * (float)local_6e0._4_4_ + fVar42);
      auVar137._28_4_ = fStack_684 + auVar247._28_4_ + fStack_464;
      fStack_31c = fVar146 * fVar100;
      local_320 = fVar143 * fVar87;
      fStack_318 = fVar20 * fVar103;
      fStack_314 = fVar25 * fVar106;
      fStack_310 = fVar30 * fVar109;
      fStack_30c = fVar35 * fVar112;
      fStack_308 = fVar40 * fVar114;
      uStack_304 = local_4a0._28_4_;
      fVar246 = auVar237._0_4_;
      fVar128 = auVar237._4_4_;
      auVar70._4_4_ = fVar146 * fVar100 * fVar128;
      auVar70._0_4_ = fVar143 * fVar87 * fVar246;
      fVar143 = auVar237._8_4_;
      auVar70._8_4_ = fVar20 * fVar103 * fVar143;
      fVar140 = auVar237._12_4_;
      auVar70._12_4_ = fVar25 * fVar106 * fVar140;
      fVar146 = auVar237._16_4_;
      auVar70._16_4_ = fVar30 * fVar109 * fVar146;
      fVar16 = auVar237._20_4_;
      auVar70._20_4_ = fVar35 * fVar112 * fVar16;
      fVar17 = auVar237._24_4_;
      auVar70._24_4_ = fVar40 * fVar114 * fVar17;
      auVar70._28_4_ = fStack_684;
      auVar247 = vsubps_avx(auVar137,auVar70);
      fStack_2fc = fVar142 * fVar183;
      local_300 = fVar208 * fVar182;
      fStack_2f8 = fVar19 * fVar184;
      fStack_2f4 = fVar24 * fVar185;
      fStack_2f0 = fVar29 * fVar186;
      fStack_2ec = fVar34 * fVar219;
      fStack_2e8 = fVar39 * fVar224;
      fStack_2e4 = (float)local_6e0._4_4_;
      auVar191._0_4_ = fVar208 * fVar182 + fVar148 * (fVar89 * (float)local_5e0._4_4_ + fVar116);
      auVar191._4_4_ = fVar142 * fVar183 + fVar154 * (fVar102 * (float)local_5e0._4_4_ + fVar147);
      auVar191._8_4_ = fVar19 * fVar184 + fVar155 * (fVar105 * (float)local_5e0._4_4_ + fVar21);
      auVar191._12_4_ = fVar24 * fVar185 + fVar156 * (fVar108 * (float)local_5e0._4_4_ + fVar26);
      auVar191._16_4_ = fVar29 * fVar186 + fVar157 * (fVar111 * (float)local_5e0._4_4_ + fVar31);
      auVar191._20_4_ = fVar34 * fVar219 + fVar158 * (fVar172 * (float)local_5e0._4_4_ + fVar36);
      auVar191._24_4_ = fVar39 * fVar224 + fVar159 * (fVar181 * (float)local_5e0._4_4_ + fVar41);
      auVar191._28_4_ = (float)local_6e0._4_4_ + fStack_684 + uStack_5e8._4_4_;
      uStack_544 = 0xff800000;
      auVar71._4_4_ = fStack_55c * fVar128;
      auVar71._0_4_ = local_560 * fVar246;
      auVar71._8_4_ = fStack_558 * fVar143;
      auVar71._12_4_ = fStack_554 * fVar140;
      auVar71._16_4_ = fStack_550 * fVar146;
      auVar71._20_4_ = fStack_54c * fVar16;
      auVar71._24_4_ = fStack_548 * fVar17;
      auVar71._28_4_ = local_4a0._28_4_;
      auVar48 = vsubps_avx(auVar191,auVar71);
      local_c0._0_8_ = local_680._0_8_ ^ 0x8000000080000000;
      local_c0._8_4_ = -fVar20;
      local_c0._12_4_ = -fVar25;
      local_c0._16_4_ = -fVar30;
      local_c0._20_4_ = -fVar35;
      local_c0._24_4_ = -fVar40;
      local_c0._28_4_ = -local_680._28_4_;
      auVar205 = vblendvps_avx(local_680,local_c0,auVar178);
      local_400 = vblendvps_avx(auVar205,auVar247,auVar232);
      auVar248 = ZEXT3264(local_500);
      auVar80._4_4_ = local_4e0;
      auVar80._0_4_ = local_4e0;
      auVar80._8_4_ = local_4e0;
      auVar80._12_4_ = local_4e0;
      auVar80._16_4_ = local_4e0;
      auVar80._20_4_ = local_4e0;
      auVar80._24_4_ = local_4e0;
      auVar80._28_4_ = local_4e0;
      auVar238 = ZEXT3264(local_520);
      local_80 = fVar202 * fVar182;
      fStack_7c = fVar141 * fVar183;
      fStack_78 = fVar18 * fVar184;
      fStack_74 = fVar23 * fVar185;
      fStack_70 = fVar28 * fVar186;
      fStack_6c = fVar33 * fVar219;
      fStack_68 = fVar38 * fVar224;
      fStack_64 = auVar205._28_4_;
      auVar152._0_4_ = fVar202 * fVar182 + fVar148 * (fVar201 + local_4e0 * fVar89);
      auVar152._4_4_ = fVar141 * fVar183 + fVar154 * (fVar207 + local_4e0 * fVar102);
      auVar152._8_4_ = fVar18 * fVar184 + fVar155 * (fVar209 + local_4e0 * fVar105);
      auVar152._12_4_ = fVar23 * fVar185 + fVar156 * (fVar210 + local_4e0 * fVar108);
      auVar152._16_4_ = fVar28 * fVar186 + fVar157 * (fVar211 + local_4e0 * fVar111);
      auVar152._20_4_ = fVar33 * fVar219 + fVar158 * (fVar212 + local_4e0 * fVar172);
      auVar152._24_4_ = fVar38 * fVar224 + fVar159 * (fVar213 + local_4e0 * fVar181);
      auVar152._28_4_ = auVar205._28_4_ + local_520._28_4_ + local_c0._28_4_;
      local_2a0 = fVar202 * fVar87;
      fStack_29c = fVar141 * fVar100;
      fStack_298 = fVar18 * fVar103;
      fStack_294 = fVar23 * fVar106;
      fStack_290 = fVar28 * fVar109;
      fStack_28c = fVar33 * fVar112;
      fStack_288 = fVar38 * fVar114;
      auVar72._4_4_ = fVar141 * fVar100 * fVar128;
      auVar72._0_4_ = fVar202 * fVar87 * fVar246;
      auVar72._8_4_ = fVar18 * fVar103 * fVar143;
      auVar72._12_4_ = fVar23 * fVar106 * fVar140;
      auVar72._16_4_ = fVar28 * fVar109 * fVar146;
      auVar72._20_4_ = fVar33 * fVar112 * fVar16;
      auVar72._24_4_ = fVar38 * fVar114 * fVar17;
      auVar72._28_4_ = fStack_284;
      local_e0._0_8_ = auVar163._0_8_ ^ 0x8000000080000000;
      local_e0._8_4_ = -fVar19;
      local_e0._12_4_ = -fVar24;
      local_e0._16_4_ = -fVar29;
      local_e0._20_4_ = -fVar34;
      local_e0._24_4_ = -fVar39;
      local_e0._28_4_ = auVar163._28_4_ ^ 0x80000000;
      auVar205 = vblendvps_avx(auVar163,local_e0,auVar178);
      auVar247 = vsubps_avx(auVar152,auVar72);
      local_3e0 = vblendvps_avx(auVar205,auVar48,auVar232);
      local_100._0_8_ = local_500._0_8_ ^ 0x8000000080000000;
      local_100._8_4_ = -fVar18;
      local_100._12_4_ = -fVar23;
      local_100._16_4_ = -fVar28;
      local_100._20_4_ = -fVar33;
      local_100._24_4_ = -fVar38;
      local_100._28_4_ = -fVar127;
      auVar217._8_4_ = 0x7f800000;
      auVar217._0_8_ = 0x7f8000007f800000;
      auVar217._12_4_ = 0x7f800000;
      auVar217._16_4_ = 0x7f800000;
      auVar217._20_4_ = 0x7f800000;
      auVar217._24_4_ = 0x7f800000;
      auVar217._28_4_ = 0x7f800000;
      auVar218 = ZEXT3264(auVar217);
      auVar205 = vblendvps_avx(local_500,local_100,auVar178);
      local_3c0 = vblendvps_avx(auVar205,auVar247,auVar232);
      auVar199._8_4_ = 0x3f800000;
      auVar199._0_8_ = 0x3f8000003f800000;
      auVar199._12_4_ = 0x3f800000;
      auVar199._16_4_ = 0x3f800000;
      auVar199._20_4_ = 0x3f800000;
      auVar199._24_4_ = 0x3f800000;
      auVar199._28_4_ = 0x3f800000;
      local_a0 = vblendvps_avx(auVar199,ZEXT832(0) << 0x20,auVar178);
      auVar73._4_4_ = fVar128 * fStack_59c;
      auVar73._0_4_ = fVar246 * local_5a0;
      auVar73._8_4_ = fVar143 * fStack_598;
      auVar73._12_4_ = fVar140 * fStack_594;
      auVar73._16_4_ = fVar146 * fStack_590;
      auVar73._20_4_ = fVar16 * fStack_58c;
      auVar73._24_4_ = fVar17 * fStack_588;
      auVar73._28_4_ = auVar237._28_4_;
      local_460 = vblendvps_avx(local_a0,auVar73,auVar232);
      local_420._0_4_ = fVar89 + fVar117;
      local_420._4_4_ = fVar102 + fVar126;
      local_420._8_4_ = fVar105 + fStack_698;
      local_420._12_4_ = fVar108 + fStack_694;
      local_420._16_4_ = fVar111 + fStack_690;
      local_420._20_4_ = fVar172 + fStack_68c;
      local_420._24_4_ = fVar181 + fStack_688;
      local_420._28_4_ = auVar192._28_4_ + fStack_684;
      auVar170 = ZEXT3264(local_420);
      local_440 = ZEXT832(0) << 0x20;
      auVar232 = vblendvps_avx(auVar217,local_420,local_660);
      auVar178 = vshufps_avx(auVar232,auVar232,0xb1);
      auVar178 = vminps_avx(auVar232,auVar178);
      auVar192 = vshufpd_avx(auVar178,auVar178,5);
      auVar178 = vminps_avx(auVar178,auVar192);
      auVar192 = vperm2f128_avx(auVar178,auVar178,1);
      auVar178 = vminps_avx(auVar178,auVar192);
      auVar178 = vcmpps_avx(auVar232,auVar178,0);
      auVar192 = local_660 & auVar178;
      auVar180 = ZEXT3264(_local_6e0);
      auVar194 = ZEXT3264(_local_5e0);
      auVar200 = ZEXT3264(auVar80);
      auVar164 = ZEXT3264(auVar163);
      auVar206 = ZEXT3264(_local_600);
      auVar232 = local_660;
      if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar192 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar192 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar192 >> 0x7f,0) != '\0') ||
            (auVar192 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar192 >> 0xbf,0) != '\0') ||
          (auVar192 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar192[0x1f] < '\0') {
        auVar232 = vandps_avx(auVar178,local_660);
      }
      uVar82 = vmovmskps_avx(auVar232);
      uVar84 = 0;
      if (uVar82 != 0) {
        for (; (uVar82 >> uVar84 & 1) == 0; uVar84 = uVar84 + 1) {
        }
      }
      uVar82 = 1 << ((byte)k & 0x1f);
      local_6a0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar82 >> 4) * 0x10);
      auVar232 = vcmpps_avx(auVar80,auVar80,0xf);
      auVar233 = ZEXT3264(auVar232);
      auVar153 = ZEXT3264(local_680);
      local_640 = local_660;
      local_5b0 = ray;
      local_5a8 = k;
      fStack_4dc = local_4e0;
      fStack_4d8 = local_4e0;
      fStack_4d4 = local_4e0;
      fStack_4d0 = local_4e0;
      fStack_4cc = local_4e0;
      fStack_4c8 = local_4e0;
      fStack_4c4 = local_4e0;
      while( true ) {
        auVar192 = auVar194._0_32_;
        auVar178 = auVar180._0_32_;
        auVar195 = auVar200._0_28_;
        auVar247 = auVar248._0_32_;
        auVar163 = auVar164._0_32_;
        auVar232 = auVar153._0_32_;
        auVar205 = auVar206._0_32_;
        auVar237 = auVar238._0_32_;
        uVar86 = (ulong)uVar84;
        uVar84 = *(uint *)(local_280 + uVar86 * 4);
        pGVar11 = (pSVar10->geometries).items[uVar84].ptr;
        local_710.ray = (RTCRayN *)ray;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_640 + uVar86 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar2 = *(undefined4 *)(local_460 + uVar86 * 4);
            uVar3 = *(undefined4 *)(local_440 + uVar86 * 4);
            uVar81 = *(uint *)(local_420 + uVar86 * 4);
            *(uint *)(ray + k * 4 + 0x100) = uVar81;
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_400 + uVar86 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_3e0 + uVar86 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_3c0 + uVar86 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar2;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar3;
            *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[uVar86];
            *(uint *)(ray + k * 4 + 0x240) = uVar84;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            goto LAB_00a804da;
          }
          local_340 = auVar170._0_32_;
          local_1c0 = *(undefined4 *)(local_460 + uVar86 * 4);
          local_1a0 = *(undefined4 *)(local_440 + uVar86 * 4);
          local_180 = (line->primIDs).field_0.i[uVar86];
          local_220._4_4_ = *(undefined4 *)(local_400 + uVar86 * 4);
          local_200._4_4_ = *(undefined4 *)(local_3e0 + uVar86 * 4);
          auStack_150 = vpshufd_avx(ZEXT416(uVar84),0);
          local_1e0._4_4_ = *(undefined4 *)(local_3c0 + uVar86 * 4);
          local_220._0_4_ = local_220._4_4_;
          local_220._8_4_ = local_220._4_4_;
          local_220._12_4_ = local_220._4_4_;
          local_220._16_4_ = local_220._4_4_;
          local_220._20_4_ = local_220._4_4_;
          local_220._24_4_ = local_220._4_4_;
          local_220._28_4_ = local_220._4_4_;
          local_200._0_4_ = local_200._4_4_;
          local_200._8_4_ = local_200._4_4_;
          local_200._12_4_ = local_200._4_4_;
          local_200._16_4_ = local_200._4_4_;
          local_200._20_4_ = local_200._4_4_;
          local_200._24_4_ = local_200._4_4_;
          local_200._28_4_ = local_200._4_4_;
          local_1e0._0_4_ = local_1e0._4_4_;
          local_1e0._8_4_ = local_1e0._4_4_;
          local_1e0._12_4_ = local_1e0._4_4_;
          local_1e0._16_4_ = local_1e0._4_4_;
          local_1e0._20_4_ = local_1e0._4_4_;
          local_1e0._24_4_ = local_1e0._4_4_;
          local_1e0._28_4_ = local_1e0._4_4_;
          uStack_1bc = local_1c0;
          uStack_1b8 = local_1c0;
          uStack_1b4 = local_1c0;
          uStack_1b0 = local_1c0;
          uStack_1ac = local_1c0;
          uStack_1a8 = local_1c0;
          uStack_1a4 = local_1c0;
          uStack_19c = local_1a0;
          uStack_198 = local_1a0;
          uStack_194 = local_1a0;
          uStack_190 = local_1a0;
          uStack_18c = local_1a0;
          uStack_188 = local_1a0;
          uStack_184 = local_1a0;
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          local_160 = auStack_150;
          uStack_13c = context->user->instID[0];
          local_140 = uStack_13c;
          uStack_138 = uStack_13c;
          uStack_134 = uStack_13c;
          uStack_130 = uStack_13c;
          uStack_12c = uStack_13c;
          uStack_128 = uStack_13c;
          uStack_124 = uStack_13c;
          uStack_11c = context->user->instPrimID[0];
          local_120 = uStack_11c;
          uStack_118 = uStack_11c;
          uStack_114 = uStack_11c;
          uStack_110 = uStack_11c;
          uStack_10c = uStack_11c;
          uStack_108 = uStack_11c;
          uStack_104 = uStack_11c;
          local_250 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_420 + uVar86 * 4);
          local_6c0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar82 & 0xf) << 4));
          local_6b0 = *local_6a0;
          local_710.valid = (int *)local_6c0;
          local_710.geometryUserPtr = pGVar11->userPtr;
          local_710.context = context->user;
          local_710.hit = (RTCHitN *)local_220;
          local_710.N = 8;
          if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_660._0_8_ = line;
            auVar232 = ZEXT1632(auVar233._0_16_);
            local_360 = auVar163;
            (*pGVar11->intersectionFilterN)(&local_710);
            auVar232 = vcmpps_avx(auVar232,auVar232,0xf);
            auVar233 = ZEXT3264(auVar232);
            auVar238 = ZEXT3264(local_520);
            auVar206 = ZEXT3264(_local_600);
            auVar248 = ZEXT3264(local_500);
            auVar164 = ZEXT3264(local_360);
            auVar200 = ZEXT3264(CONCAT428(fStack_4c4,
                                          CONCAT424(fStack_4c8,
                                                    CONCAT420(fStack_4cc,
                                                              CONCAT416(fStack_4d0,
                                                                        CONCAT412(fStack_4d4,
                                                                                  CONCAT48(
                                                  fStack_4d8,CONCAT44(fStack_4dc,local_4e0))))))));
            auVar194 = ZEXT3264(_local_5e0);
            auVar180 = ZEXT3264(_local_6e0);
            auVar218 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            line = (Primitive *)local_660._0_8_;
          }
          auVar129 = ZEXT816(0) << 0x40;
          auVar91 = vpcmpeqd_avx(auVar129,local_6c0);
          auVar43 = vpcmpeqd_avx(auVar129,local_6b0);
          auVar138._16_16_ = auVar43;
          auVar138._0_16_ = auVar91;
          auVar232 = auVar233._0_32_ & ~auVar138;
          if ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar232 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar232 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar232 >> 0x7f,0) == '\0') &&
                (auVar232 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar232 >> 0xbf,0) == '\0') &&
              (auVar232 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar232[0x1f]) {
            auVar96._0_4_ = auVar233._0_4_ ^ auVar91._0_4_;
            auVar96._4_4_ = auVar233._4_4_ ^ auVar91._4_4_;
            auVar96._8_4_ = auVar233._8_4_ ^ auVar91._8_4_;
            auVar96._12_4_ = auVar233._12_4_ ^ auVar91._12_4_;
            auVar96._16_4_ = auVar233._16_4_ ^ auVar43._0_4_;
            auVar96._20_4_ = auVar233._20_4_ ^ auVar43._4_4_;
            auVar96._24_4_ = auVar233._24_4_ ^ auVar43._8_4_;
            auVar96._28_4_ = auVar233._28_4_ ^ auVar43._12_4_;
            auVar153 = ZEXT3264(local_680);
            auVar170 = ZEXT3264(local_340);
          }
          else {
            p_Var15 = context->args->filter;
            auVar153 = ZEXT3264(local_680);
            auVar170 = ZEXT3264(local_340);
            if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              local_660._0_8_ = line;
              local_360 = auVar164._0_32_;
              auVar232 = ZEXT1632(auVar233._0_16_);
              (*p_Var15)(&local_710);
              auVar129 = ZEXT816(0) << 0x40;
              auVar232 = vcmpps_avx(auVar232,auVar232,0xf);
              auVar233 = ZEXT3264(auVar232);
              auVar170 = ZEXT3264(local_340);
              auVar153 = ZEXT3264(local_680);
              auVar238 = ZEXT3264(local_520);
              auVar206 = ZEXT3264(_local_600);
              auVar248 = ZEXT3264(local_500);
              auVar164 = ZEXT3264(local_360);
              auVar200 = ZEXT3264(CONCAT428(fStack_4c4,
                                            CONCAT424(fStack_4c8,
                                                      CONCAT420(fStack_4cc,
                                                                CONCAT416(fStack_4d0,
                                                                          CONCAT412(fStack_4d4,
                                                                                    CONCAT48(
                                                  fStack_4d8,CONCAT44(fStack_4dc,local_4e0))))))));
              auVar194 = ZEXT3264(_local_5e0);
              auVar180 = ZEXT3264(_local_6e0);
              auVar218 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              line = (Primitive *)local_660._0_8_;
            }
            auVar91 = vpcmpeqd_avx(auVar129,local_6c0);
            auVar43 = vpcmpeqd_avx(auVar129,local_6b0);
            auVar123._16_16_ = auVar43;
            auVar123._0_16_ = auVar91;
            auVar96._0_4_ = auVar233._0_4_ ^ auVar91._0_4_;
            auVar96._4_4_ = auVar233._4_4_ ^ auVar91._4_4_;
            auVar96._8_4_ = auVar233._8_4_ ^ auVar91._8_4_;
            auVar96._12_4_ = auVar233._12_4_ ^ auVar91._12_4_;
            auVar96._16_4_ = auVar233._16_4_ ^ auVar43._0_4_;
            auVar96._20_4_ = auVar233._20_4_ ^ auVar43._4_4_;
            auVar96._24_4_ = auVar233._24_4_ ^ auVar43._8_4_;
            auVar96._28_4_ = auVar233._28_4_ ^ auVar43._12_4_;
            auVar232 = auVar233._0_32_ & ~auVar123;
            if ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar232 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar232 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar232 >> 0x7f,0) != '\0') ||
                  (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar232 >> 0xbf,0) != '\0') ||
                (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar232[0x1f] < '\0') {
              auVar232 = vmaskmovps_avx(auVar96,*(undefined1 (*) [32])local_710.hit);
              *(undefined1 (*) [32])(local_710.ray + 0x180) = auVar232;
              auVar232 = vmaskmovps_avx(auVar96,*(undefined1 (*) [32])(local_710.hit + 0x20));
              *(undefined1 (*) [32])(local_710.ray + 0x1a0) = auVar232;
              auVar232 = vmaskmovps_avx(auVar96,*(undefined1 (*) [32])(local_710.hit + 0x40));
              *(undefined1 (*) [32])(local_710.ray + 0x1c0) = auVar232;
              auVar232 = vmaskmovps_avx(auVar96,*(undefined1 (*) [32])(local_710.hit + 0x60));
              *(undefined1 (*) [32])(local_710.ray + 0x1e0) = auVar232;
              auVar232 = vmaskmovps_avx(auVar96,*(undefined1 (*) [32])(local_710.hit + 0x80));
              *(undefined1 (*) [32])(local_710.ray + 0x200) = auVar232;
              auVar232 = vmaskmovps_avx(auVar96,*(undefined1 (*) [32])(local_710.hit + 0xa0));
              *(undefined1 (*) [32])(local_710.ray + 0x220) = auVar232;
              auVar232 = vmaskmovps_avx(auVar96,*(undefined1 (*) [32])(local_710.hit + 0xc0));
              *(undefined1 (*) [32])(local_710.ray + 0x240) = auVar232;
              auVar232 = vmaskmovps_avx(auVar96,*(undefined1 (*) [32])(local_710.hit + 0xe0));
              *(undefined1 (*) [32])(local_710.ray + 0x260) = auVar232;
              auVar232 = vmaskmovps_avx(auVar96,*(undefined1 (*) [32])(local_710.hit + 0x100));
              *(undefined1 (*) [32])(local_710.ray + 0x280) = auVar232;
            }
          }
          if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar96 >> 0x7f,0) == '\0') &&
                (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar96 >> 0xbf,0) == '\0') &&
              (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar96[0x1f]) {
            *(int *)(ray + k * 4 + 0x100) = local_250._0_4_;
            auVar91 = local_250;
          }
          else {
            auVar91 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
          }
          *(undefined4 *)(local_640 + uVar86 * 4) = 0;
          auVar91 = vshufps_avx(auVar91,auVar91,0);
          auVar97._16_16_ = auVar91;
          auVar97._0_16_ = auVar91;
          auVar232 = vcmpps_avx(auVar170._0_32_,auVar97,2);
          local_640 = vandps_avx(auVar232,local_640);
        }
        auVar192 = auVar194._0_32_;
        auVar178 = auVar180._0_32_;
        auVar195 = auVar200._0_28_;
        auVar247 = auVar248._0_32_;
        auVar163 = auVar164._0_32_;
        auVar232 = auVar153._0_32_;
        auVar205 = auVar206._0_32_;
        auVar237 = auVar238._0_32_;
        if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_640 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_640 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_640 >> 0x7f,0) == '\0') &&
              (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_640 >> 0xbf,0) == '\0') &&
            (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_640[0x1f]) break;
        auVar232 = vblendvps_avx(auVar218._0_32_,auVar170._0_32_,local_640);
        auVar163 = vshufps_avx(auVar232,auVar232,0xb1);
        auVar163 = vminps_avx(auVar232,auVar163);
        auVar178 = vshufpd_avx(auVar163,auVar163,5);
        auVar163 = vminps_avx(auVar163,auVar178);
        auVar178 = vperm2f128_avx(auVar163,auVar163,1);
        auVar163 = vminps_avx(auVar163,auVar178);
        auVar163 = vcmpps_avx(auVar232,auVar163,0);
        auVar178 = local_640 & auVar163;
        auVar232 = local_640;
        if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar178 >> 0x7f,0) != '\0') ||
              (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar178 >> 0xbf,0) != '\0') ||
            (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar178[0x1f] < '\0') {
          auVar232 = vandps_avx(auVar163,local_640);
        }
        uVar81 = vmovmskps_avx(auVar232);
        uVar84 = 0;
        if (uVar81 != 0) {
          for (; (uVar81 >> uVar84 & 1) == 0; uVar84 = uVar84 + 1) {
          }
        }
      }
      uVar81 = *(uint *)(ray + k * 4 + 0x100);
LAB_00a804da:
      auVar164 = ZEXT464(uVar81);
      auVar48 = vandps_avx(local_4c0,local_4a0);
      auVar91 = vshufps_avx(ZEXT416(uVar81),ZEXT416(uVar81),0);
      auVar124._16_16_ = auVar91;
      auVar124._0_16_ = auVar91;
      auVar49 = vcmpps_avx(local_620,auVar124,2);
      auVar44 = auVar48 & auVar49;
      if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar44 >> 0x7f,0) != '\0') ||
            (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar44 >> 0xbf,0) != '\0') ||
          (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar44[0x1f] < '\0') {
        auVar44 = vcmpps_avx(local_2e0,local_540,0);
        auVar232 = vblendvps_avx(auVar232,local_c0,auVar44);
        auVar163 = vblendvps_avx(auVar163,local_e0,auVar44);
        auVar247 = vblendvps_avx(auVar247,local_100,auVar44);
        auVar44 = vcmpps_avx(local_2e0,local_380,0);
        auVar45 = vcmpps_avx(local_2e0,local_580,0);
        auVar44 = vorps_avx(auVar44,auVar45);
        fVar202 = local_2e0._0_4_;
        fVar208 = local_2e0._4_4_;
        fVar246 = local_2e0._8_4_;
        fVar143 = local_2e0._12_4_;
        fVar116 = local_2e0._16_4_;
        fVar128 = local_2e0._20_4_;
        fVar140 = local_2e0._24_4_;
        auVar169._0_4_ =
             (float)local_240._0_4_ * (fVar202 * auVar178._0_4_ + (float)local_480._0_4_) +
             local_2c0;
        auVar169._4_4_ =
             (float)local_240._4_4_ * (fVar208 * auVar178._4_4_ + (float)local_480._4_4_) +
             fStack_2bc;
        auVar169._8_4_ = fStack_238 * (fVar246 * auVar178._8_4_ + fStack_478) + fStack_2b8;
        auVar169._12_4_ = fStack_234 * (fVar143 * auVar178._12_4_ + fStack_474) + fStack_2b4;
        auVar169._16_4_ = fStack_230 * (fVar116 * auVar178._16_4_ + fStack_470) + fStack_2b0;
        auVar169._20_4_ = fStack_22c * (fVar128 * auVar178._20_4_ + fStack_46c) + fStack_2ac;
        auVar169._24_4_ = fStack_228 * (fVar140 * auVar178._24_4_ + fStack_468) + fStack_2a8;
        auVar169._28_4_ = auVar45._28_4_ + fStack_464 + fStack_2a4;
        auVar179._0_4_ =
             (float)local_240._0_4_ * (auVar205._0_4_ + auVar192._0_4_ * fVar202) + local_300;
        auVar179._4_4_ =
             (float)local_240._4_4_ * (auVar205._4_4_ + auVar192._4_4_ * fVar208) + fStack_2fc;
        auVar179._8_4_ = fStack_238 * (auVar205._8_4_ + auVar192._8_4_ * fVar246) + fStack_2f8;
        auVar179._12_4_ = fStack_234 * (auVar205._12_4_ + auVar192._12_4_ * fVar143) + fStack_2f4;
        auVar179._16_4_ = fStack_230 * (auVar205._16_4_ + auVar192._16_4_ * fVar116) + fStack_2f0;
        auVar179._20_4_ = fStack_22c * (auVar205._20_4_ + auVar192._20_4_ * fVar128) + fStack_2ec;
        auVar179._24_4_ = fStack_228 * (auVar205._24_4_ + auVar192._24_4_ * fVar140) + fStack_2e8;
        auVar179._28_4_ = auVar205._28_4_ + auVar178._28_4_ + fStack_2e4;
        auVar193._0_4_ =
             (float)local_240._0_4_ * (auVar237._0_4_ + auVar195._0_4_ * fVar202) + local_80;
        auVar193._4_4_ =
             (float)local_240._4_4_ * (auVar237._4_4_ + auVar195._4_4_ * fVar208) + fStack_7c;
        auVar193._8_4_ = fStack_238 * (auVar237._8_4_ + auVar195._8_4_ * fVar246) + fStack_78;
        auVar193._12_4_ = fStack_234 * (auVar237._12_4_ + auVar195._12_4_ * fVar143) + fStack_74;
        auVar193._16_4_ = fStack_230 * (auVar237._16_4_ + auVar195._16_4_ * fVar116) + fStack_70;
        auVar193._20_4_ = fStack_22c * (auVar237._20_4_ + auVar195._20_4_ * fVar128) + fStack_6c;
        auVar193._24_4_ = fStack_228 * (auVar237._24_4_ + auVar195._24_4_ * fVar140) + fStack_68;
        auVar193._28_4_ = auVar237._28_4_ + auVar192._28_4_ + fStack_64;
        auVar74._4_4_ = (float)local_3a0._4_4_ * fStack_31c;
        auVar74._0_4_ = (float)local_3a0._0_4_ * local_320;
        auVar74._8_4_ = fStack_398 * fStack_318;
        auVar74._12_4_ = fStack_394 * fStack_314;
        auVar74._16_4_ = fStack_390 * fStack_310;
        auVar74._20_4_ = fStack_38c * fStack_30c;
        auVar74._24_4_ = fStack_388 * fStack_308;
        auVar74._28_4_ = uStack_224;
        auVar178 = vsubps_avx(auVar169,auVar74);
        auVar75._4_4_ = (float)local_3a0._4_4_ * fStack_55c;
        auVar75._0_4_ = (float)local_3a0._0_4_ * local_560;
        auVar75._8_4_ = fStack_398 * fStack_558;
        auVar75._12_4_ = fStack_394 * fStack_554;
        auVar75._16_4_ = fStack_390 * fStack_550;
        auVar75._20_4_ = fStack_38c * fStack_54c;
        auVar75._24_4_ = fStack_388 * fStack_548;
        auVar75._28_4_ = uStack_224;
        auVar192 = vsubps_avx(auVar179,auVar75);
        auVar76._4_4_ = (float)local_3a0._4_4_ * fStack_29c;
        auVar76._0_4_ = (float)local_3a0._0_4_ * local_2a0;
        auVar76._8_4_ = fStack_398 * fStack_298;
        auVar76._12_4_ = fStack_394 * fStack_294;
        auVar76._16_4_ = fStack_390 * fStack_290;
        auVar76._20_4_ = fStack_38c * fStack_28c;
        auVar76._24_4_ = fStack_388 * fStack_288;
        auVar76._28_4_ = uStack_224;
        auVar205 = vsubps_avx(auVar193,auVar76);
        local_400 = vblendvps_avx(auVar232,auVar178,auVar44);
        local_3e0 = vblendvps_avx(auVar163,auVar192,auVar44);
        local_3c0 = vblendvps_avx(auVar247,auVar205,auVar44);
        auVar77._4_4_ = (float)local_3a0._4_4_ * fStack_59c;
        auVar77._0_4_ = (float)local_3a0._0_4_ * local_5a0;
        auVar77._8_4_ = fStack_398 * fStack_598;
        auVar77._12_4_ = fStack_394 * fStack_594;
        auVar77._16_4_ = fStack_390 * fStack_590;
        auVar77._20_4_ = fStack_38c * fStack_58c;
        auVar77._24_4_ = fStack_388 * fStack_588;
        auVar77._28_4_ = auVar178._28_4_;
        local_460 = vblendvps_avx(local_a0,auVar77,auVar44);
        local_640 = vandps_avx(auVar49,auVar48);
        local_440 = ZEXT832(0) << 0x20;
        local_420 = local_620;
        auVar232 = vblendvps_avx(auVar218._0_32_,local_620,local_640);
        auVar163 = vshufps_avx(auVar232,auVar232,0xb1);
        auVar163 = vminps_avx(auVar232,auVar163);
        auVar178 = vshufpd_avx(auVar163,auVar163,5);
        auVar163 = vminps_avx(auVar163,auVar178);
        auVar178 = vperm2f128_avx(auVar163,auVar163,1);
        auVar163 = vminps_avx(auVar163,auVar178);
        auVar163 = vcmpps_avx(auVar232,auVar163,0);
        auVar85 = (undefined1  [8])context->scene;
        auVar178 = local_640 & auVar163;
        auVar232 = local_640;
        if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar178 >> 0x7f,0) != '\0') ||
              (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar178 >> 0xbf,0) != '\0') ||
            (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar178[0x1f] < '\0') {
          auVar232 = vandps_avx(auVar163,local_640);
        }
        uVar81 = vmovmskps_avx(auVar232);
        uVar84 = 0;
        if (uVar81 != 0) {
          for (; (uVar81 >> uVar84 & 1) == 0; uVar84 = uVar84 + 1) {
          }
        }
        auVar232 = vcmpps_avx(local_a0,local_a0,0xf);
        auVar170 = ZEXT3264(auVar232);
        auVar180 = ZEXT864(0) << 0x20;
        do {
          uVar86 = (ulong)uVar84;
          uVar84 = *(uint *)(local_280 + uVar86 * 4);
          pGVar11 = (((Scene *)auVar85)->geometries).items[uVar84].ptr;
          if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            *(undefined4 *)(local_640 + uVar86 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar2 = *(undefined4 *)(local_460 + uVar86 * 4);
              uVar3 = *(undefined4 *)(local_440 + uVar86 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_420 + uVar86 * 4);
              *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_400 + uVar86 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_3e0 + uVar86 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_3c0 + uVar86 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar2;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar3;
              *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[uVar86];
              *(uint *)(ray + k * 4 + 0x240) = uVar84;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              return;
            }
            local_1c0 = *(undefined4 *)(local_460 + uVar86 * 4);
            local_1a0 = *(undefined4 *)(local_440 + uVar86 * 4);
            auStack_150 = vpshufd_avx(ZEXT416(uVar84),0);
            local_180 = (line->primIDs).field_0.i[uVar86];
            uVar2 = *(undefined4 *)(local_400 + uVar86 * 4);
            local_220._4_4_ = uVar2;
            local_220._0_4_ = uVar2;
            local_220._8_4_ = uVar2;
            local_220._12_4_ = uVar2;
            local_220._16_4_ = uVar2;
            local_220._20_4_ = uVar2;
            local_220._24_4_ = uVar2;
            local_220._28_4_ = uVar2;
            uVar2 = *(undefined4 *)(local_3e0 + uVar86 * 4);
            local_200._4_4_ = uVar2;
            local_200._0_4_ = uVar2;
            local_200._8_4_ = uVar2;
            local_200._12_4_ = uVar2;
            local_200._16_4_ = uVar2;
            local_200._20_4_ = uVar2;
            local_200._24_4_ = uVar2;
            local_200._28_4_ = uVar2;
            uVar2 = *(undefined4 *)(local_3c0 + uVar86 * 4);
            local_1e0._4_4_ = uVar2;
            local_1e0._0_4_ = uVar2;
            local_1e0._8_4_ = uVar2;
            local_1e0._12_4_ = uVar2;
            local_1e0._16_4_ = uVar2;
            local_1e0._20_4_ = uVar2;
            local_1e0._24_4_ = uVar2;
            local_1e0._28_4_ = uVar2;
            uStack_1bc = local_1c0;
            uStack_1b8 = local_1c0;
            uStack_1b4 = local_1c0;
            uStack_1b0 = local_1c0;
            uStack_1ac = local_1c0;
            uStack_1a8 = local_1c0;
            uStack_1a4 = local_1c0;
            uStack_19c = local_1a0;
            uStack_198 = local_1a0;
            uStack_194 = local_1a0;
            uStack_190 = local_1a0;
            uStack_18c = local_1a0;
            uStack_188 = local_1a0;
            uStack_184 = local_1a0;
            uStack_17c = local_180;
            uStack_178 = local_180;
            uStack_174 = local_180;
            uStack_170 = local_180;
            uStack_16c = local_180;
            uStack_168 = local_180;
            uStack_164 = local_180;
            local_160 = auStack_150;
            uStack_13c = context->user->instID[0];
            local_140 = uStack_13c;
            uStack_138 = uStack_13c;
            uStack_134 = uStack_13c;
            uStack_130 = uStack_13c;
            uStack_12c = uStack_13c;
            uStack_128 = uStack_13c;
            uStack_124 = uStack_13c;
            uStack_11c = context->user->instPrimID[0];
            local_120 = uStack_11c;
            uStack_118 = uStack_11c;
            uStack_114 = uStack_11c;
            uStack_110 = uStack_11c;
            uStack_10c = uStack_11c;
            uStack_108 = uStack_11c;
            uStack_104 = uStack_11c;
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_420 + uVar86 * 4);
            local_6c0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar82 & 0xf) << 4));
            local_6b0 = *local_6a0;
            local_710.valid = (int *)local_6c0;
            local_710.geometryUserPtr = pGVar11->userPtr;
            local_710.context = context->user;
            local_710.hit = (RTCHitN *)local_220;
            local_710.N = 8;
            local_710.ray = (RTCRayN *)ray;
            if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              local_660._0_8_ = line;
              local_680._0_16_ = auVar164._0_16_;
              local_6e0 = auVar85;
              auVar232 = ZEXT1632(auVar170._0_16_);
              (*pGVar11->intersectionFilterN)(&local_710);
              auVar180 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar232 = vcmpps_avx(auVar232,auVar232,0xf);
              auVar170 = ZEXT3264(auVar232);
              auVar164 = ZEXT1664(local_680._0_16_);
              auVar85 = local_6e0;
              line = (Primitive *)local_660._0_8_;
            }
            auVar91 = vpcmpeqd_avx(auVar180._0_16_,local_6c0);
            auVar43 = vpcmpeqd_avx(auVar180._0_16_,local_6b0);
            auVar139._16_16_ = auVar43;
            auVar139._0_16_ = auVar91;
            auVar232 = auVar170._0_32_ & ~auVar139;
            if ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar232 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar232 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar232 >> 0x7f,0) == '\0') &&
                  (auVar232 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar232 >> 0xbf,0) == '\0') &&
                (auVar232 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar232[0x1f]) {
              auVar98._0_4_ = auVar91._0_4_ ^ auVar170._0_4_;
              auVar98._4_4_ = auVar91._4_4_ ^ auVar170._4_4_;
              auVar98._8_4_ = auVar91._8_4_ ^ auVar170._8_4_;
              auVar98._12_4_ = auVar91._12_4_ ^ auVar170._12_4_;
              auVar98._16_4_ = auVar43._0_4_ ^ auVar170._16_4_;
              auVar98._20_4_ = auVar43._4_4_ ^ auVar170._20_4_;
              auVar98._24_4_ = auVar43._8_4_ ^ auVar170._24_4_;
              auVar98._28_4_ = auVar43._12_4_ ^ auVar170._28_4_;
              auVar218 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            }
            else {
              p_Var15 = context->args->filter;
              if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0))))
              {
                local_680._0_16_ = auVar164._0_16_;
                local_6e0 = auVar85;
                auVar232 = ZEXT1632(auVar170._0_16_);
                (*p_Var15)(&local_710);
                auVar180 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar232 = vcmpps_avx(auVar232,auVar232,0xf);
                auVar170 = ZEXT3264(auVar232);
                auVar164 = ZEXT1664(local_680._0_16_);
                auVar85 = local_6e0;
              }
              auVar91 = vpcmpeqd_avx(auVar180._0_16_,local_6c0);
              auVar43 = vpcmpeqd_avx(auVar180._0_16_,local_6b0);
              auVar125._16_16_ = auVar43;
              auVar125._0_16_ = auVar91;
              auVar98._0_4_ = auVar91._0_4_ ^ auVar170._0_4_;
              auVar98._4_4_ = auVar91._4_4_ ^ auVar170._4_4_;
              auVar98._8_4_ = auVar91._8_4_ ^ auVar170._8_4_;
              auVar98._12_4_ = auVar91._12_4_ ^ auVar170._12_4_;
              auVar98._16_4_ = auVar43._0_4_ ^ auVar170._16_4_;
              auVar98._20_4_ = auVar43._4_4_ ^ auVar170._20_4_;
              auVar98._24_4_ = auVar43._8_4_ ^ auVar170._24_4_;
              auVar98._28_4_ = auVar43._12_4_ ^ auVar170._28_4_;
              auVar232 = auVar170._0_32_ & ~auVar125;
              auVar218 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              if ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar232 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar232 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar232 >> 0x7f,0) != '\0') ||
                    (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar232 >> 0xbf,0) != '\0') ||
                  (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar232[0x1f] < '\0') {
                auVar232 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])local_710.hit);
                *(undefined1 (*) [32])(local_710.ray + 0x180) = auVar232;
                auVar232 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_710.hit + 0x20));
                *(undefined1 (*) [32])(local_710.ray + 0x1a0) = auVar232;
                auVar232 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_710.hit + 0x40));
                *(undefined1 (*) [32])(local_710.ray + 0x1c0) = auVar232;
                auVar232 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_710.hit + 0x60));
                *(undefined1 (*) [32])(local_710.ray + 0x1e0) = auVar232;
                auVar232 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_710.hit + 0x80));
                *(undefined1 (*) [32])(local_710.ray + 0x200) = auVar232;
                auVar232 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_710.hit + 0xa0));
                *(undefined1 (*) [32])(local_710.ray + 0x220) = auVar232;
                auVar232 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_710.hit + 0xc0));
                *(undefined1 (*) [32])(local_710.ray + 0x240) = auVar232;
                auVar232 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_710.hit + 0xe0));
                *(undefined1 (*) [32])(local_710.ray + 0x260) = auVar232;
                auVar232 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_710.hit + 0x100));
                *(undefined1 (*) [32])(local_710.ray + 0x280) = auVar232;
              }
            }
            if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar98 >> 0x7f,0) == '\0') &&
                  (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar98 >> 0xbf,0) == '\0') &&
                (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar98[0x1f]) {
              *(int *)(ray + k * 4 + 0x100) = auVar164._0_4_;
            }
            else {
              auVar164 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
            }
            *(undefined4 *)(local_640 + uVar86 * 4) = 0;
            auVar91 = vshufps_avx(auVar164._0_16_,auVar164._0_16_,0);
            auVar99._16_16_ = auVar91;
            auVar99._0_16_ = auVar91;
            auVar232 = vcmpps_avx(local_620,auVar99,2);
            local_640 = vandps_avx(auVar232,local_640);
          }
          if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_640 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_640 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_640 >> 0x7f,0) == '\0') &&
                (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_640 >> 0xbf,0) == '\0') &&
              (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_640[0x1f]) {
            return;
          }
          auVar232 = vblendvps_avx(auVar218._0_32_,local_620,local_640);
          auVar163 = vshufps_avx(auVar232,auVar232,0xb1);
          auVar163 = vminps_avx(auVar232,auVar163);
          auVar178 = vshufpd_avx(auVar163,auVar163,5);
          auVar163 = vminps_avx(auVar163,auVar178);
          auVar178 = vperm2f128_avx(auVar163,auVar163,1);
          auVar163 = vminps_avx(auVar163,auVar178);
          auVar163 = vcmpps_avx(auVar232,auVar163,0);
          auVar178 = local_640 & auVar163;
          auVar232 = local_640;
          if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar178 >> 0x7f,0) != '\0') ||
                (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar178 >> 0xbf,0) != '\0') ||
              (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar178[0x1f] < '\0') {
            auVar232 = vandps_avx(auVar163,local_640);
          }
          uVar81 = vmovmskps_avx(auVar232);
          uVar84 = 0;
          if (uVar81 != 0) {
            for (; (uVar81 >> uVar84 & 1) == 0; uVar84 = uVar84 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context,  const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }